

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  bool bVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  ulong uVar55;
  long lVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  bool bVar61;
  LinearSpace3fa *pLVar62;
  bool bVar63;
  float fVar64;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined4 uVar65;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  float fVar74;
  float fVar95;
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  vint4 ai_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar137;
  float fVar151;
  float fVar152;
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar153;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [32];
  float fVar157;
  undefined8 uVar158;
  float fVar176;
  vfloat4 b0;
  float fVar174;
  float fVar178;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar175;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar177;
  float fVar179;
  undefined1 auVar173 [32];
  vfloat4 a0_3;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar232;
  __m128 a;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar233;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  vfloat4 a0_1;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar255;
  float fVar265;
  float fVar266;
  vfloat4 a0;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar267;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [32];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_669;
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_628 [8];
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  float local_608;
  float fStack_604;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 *local_538;
  LinearSpace3fa *local_530;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  uint auStack_408 [4];
  RTCFilterFunctionNArguments local_3f8;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar56;
  undefined1 auVar118 [32];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar64 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar126._0_4_ = fVar64 * auVar7._0_4_;
  auVar126._4_4_ = fVar64 * auVar7._4_4_;
  auVar126._8_4_ = fVar64 * auVar7._8_4_;
  auVar126._12_4_ = fVar64 * auVar7._12_4_;
  auVar138._0_4_ = fVar64 * auVar71._0_4_;
  auVar138._4_4_ = fVar64 * auVar71._4_4_;
  auVar138._8_4_ = fVar64 * auVar71._8_4_;
  auVar138._12_4_ = fVar64 * auVar71._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar272 = vcvtdq2ps_avx(auVar272);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar60 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar55 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + uVar60 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar55 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar268._4_4_ = auVar138._0_4_;
  auVar268._0_4_ = auVar138._0_4_;
  auVar268._8_4_ = auVar138._0_4_;
  auVar268._12_4_ = auVar138._0_4_;
  auVar76 = vshufps_avx(auVar138,auVar138,0x55);
  auVar202 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar64 = auVar202._0_4_;
  auVar237._0_4_ = fVar64 * auVar272._0_4_;
  fVar136 = auVar202._4_4_;
  auVar237._4_4_ = fVar136 * auVar272._4_4_;
  fVar151 = auVar202._8_4_;
  auVar237._8_4_ = fVar151 * auVar272._8_4_;
  fVar152 = auVar202._12_4_;
  auVar237._12_4_ = fVar152 * auVar272._12_4_;
  auVar224._0_4_ = auVar10._0_4_ * fVar64;
  auVar224._4_4_ = auVar10._4_4_ * fVar136;
  auVar224._8_4_ = auVar10._8_4_ * fVar151;
  auVar224._12_4_ = auVar10._12_4_ * fVar152;
  auVar195._0_4_ = auVar96._0_4_ * fVar64;
  auVar195._4_4_ = auVar96._4_4_ * fVar136;
  auVar195._8_4_ = auVar96._8_4_ * fVar151;
  auVar195._12_4_ = auVar96._12_4_ * fVar152;
  auVar202 = vfmadd231ps_fma(auVar237,auVar76,auVar71);
  auVar77 = vfmadd231ps_fma(auVar224,auVar76,auVar9);
  auVar76 = vfmadd231ps_fma(auVar195,auVar66,auVar76);
  auVar110 = vfmadd231ps_fma(auVar202,auVar268,auVar7);
  auVar77 = vfmadd231ps_fma(auVar77,auVar268,auVar8);
  auVar122 = vfmadd231ps_fma(auVar76,auVar67,auVar268);
  auVar269._4_4_ = auVar126._0_4_;
  auVar269._0_4_ = auVar126._0_4_;
  auVar269._8_4_ = auVar126._0_4_;
  auVar269._12_4_ = auVar126._0_4_;
  auVar76 = vshufps_avx(auVar126,auVar126,0x55);
  auVar202 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar64 = auVar202._0_4_;
  auVar139._0_4_ = fVar64 * auVar272._0_4_;
  fVar136 = auVar202._4_4_;
  auVar139._4_4_ = fVar136 * auVar272._4_4_;
  fVar151 = auVar202._8_4_;
  auVar139._8_4_ = fVar151 * auVar272._8_4_;
  fVar152 = auVar202._12_4_;
  auVar139._12_4_ = fVar152 * auVar272._12_4_;
  auVar75._0_4_ = auVar10._0_4_ * fVar64;
  auVar75._4_4_ = auVar10._4_4_ * fVar136;
  auVar75._8_4_ = auVar10._8_4_ * fVar151;
  auVar75._12_4_ = auVar10._12_4_ * fVar152;
  auVar202._0_4_ = auVar96._0_4_ * fVar64;
  auVar202._4_4_ = auVar96._4_4_ * fVar136;
  auVar202._8_4_ = auVar96._8_4_ * fVar151;
  auVar202._12_4_ = auVar96._12_4_ * fVar152;
  auVar71 = vfmadd231ps_fma(auVar139,auVar76,auVar71);
  auVar272 = vfmadd231ps_fma(auVar75,auVar76,auVar9);
  auVar9 = vfmadd231ps_fma(auVar202,auVar76,auVar66);
  auVar10 = vfmadd231ps_fma(auVar71,auVar269,auVar7);
  auVar66 = vfmadd231ps_fma(auVar272,auVar269,auVar8);
  auVar96 = vfmadd231ps_fma(auVar9,auVar269,auVar67);
  auVar277._8_4_ = 0x7fffffff;
  auVar277._0_8_ = 0x7fffffff7fffffff;
  auVar277._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar110,auVar277);
  auVar121._8_4_ = 0x219392ef;
  auVar121._0_8_ = 0x219392ef219392ef;
  auVar121._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar121,1);
  auVar71 = vblendvps_avx(auVar110,auVar121,auVar7);
  auVar7 = vandps_avx(auVar77,auVar277);
  auVar7 = vcmpps_avx(auVar7,auVar121,1);
  auVar272 = vblendvps_avx(auVar77,auVar121,auVar7);
  auVar7 = vandps_avx(auVar122,auVar277);
  auVar7 = vcmpps_avx(auVar7,auVar121,1);
  auVar7 = vblendvps_avx(auVar122,auVar121,auVar7);
  auVar8 = vrcpps_avx(auVar71);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = &DAT_3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar71,auVar8,auVar183);
  auVar8 = vfmadd132ps_fma(auVar71,auVar8,auVar8);
  auVar71 = vrcpps_avx(auVar272);
  auVar272 = vfnmadd213ps_fma(auVar272,auVar71,auVar183);
  auVar9 = vfmadd132ps_fma(auVar272,auVar71,auVar71);
  auVar71 = vrcpps_avx(auVar7);
  auVar272 = vfnmadd213ps_fma(auVar7,auVar71,auVar183);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar67 = vfmadd132ps_fma(auVar272,auVar71,auVar71);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar10);
  auVar122._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar122._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar122._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar122._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar71);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar10);
  auVar140._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar140._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar140._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar140._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar77._1_3_ = 0;
  auVar77[0] = PVar2;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar71 = vpmovsxwd_avx(auVar272);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar60 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar66);
  auVar196._0_4_ = auVar7._0_4_ * auVar9._0_4_;
  auVar196._4_4_ = auVar7._4_4_ * auVar9._4_4_;
  auVar196._8_4_ = auVar7._8_4_ * auVar9._8_4_;
  auVar196._12_4_ = auVar7._12_4_ * auVar9._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar71);
  auVar7 = vsubps_avx(auVar7,auVar66);
  auVar76._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar76._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar76._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar76._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar55 + uVar60 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar96);
  auVar110._0_4_ = auVar67._0_4_ * auVar7._0_4_;
  auVar110._4_4_ = auVar67._4_4_ * auVar7._4_4_;
  auVar110._8_4_ = auVar67._8_4_ * auVar7._8_4_;
  auVar110._12_4_ = auVar67._12_4_ * auVar7._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar96);
  auVar66._0_4_ = auVar67._0_4_ * auVar7._0_4_;
  auVar66._4_4_ = auVar67._4_4_ * auVar7._4_4_;
  auVar66._8_4_ = auVar67._8_4_ * auVar7._8_4_;
  auVar66._12_4_ = auVar67._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar122,auVar140);
  auVar71 = vpminsd_avx(auVar196,auVar76);
  auVar7 = vmaxps_avx(auVar7,auVar71);
  auVar71 = vpminsd_avx(auVar110,auVar66);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar213._4_4_ = uVar65;
  auVar213._0_4_ = uVar65;
  auVar213._8_4_ = uVar65;
  auVar213._12_4_ = uVar65;
  auVar71 = vmaxps_avx(auVar71,auVar213);
  auVar7 = vmaxps_avx(auVar7,auVar71);
  local_368._0_4_ = auVar7._0_4_ * 0.99999964;
  local_368._4_4_ = auVar7._4_4_ * 0.99999964;
  local_368._8_4_ = auVar7._8_4_ * 0.99999964;
  local_368._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar122,auVar140);
  auVar71 = vpmaxsd_avx(auVar196,auVar76);
  auVar7 = vminps_avx(auVar7,auVar71);
  auVar71 = vpmaxsd_avx(auVar110,auVar66);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96._4_4_ = uVar65;
  auVar96._0_4_ = uVar65;
  auVar96._8_4_ = uVar65;
  auVar96._12_4_ = uVar65;
  auVar71 = vminps_avx(auVar71,auVar96);
  auVar7 = vminps_avx(auVar7,auVar71);
  auVar67._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar67._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar67._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar67._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar77[4] = PVar2;
  auVar77._5_3_ = 0;
  auVar77[8] = PVar2;
  auVar77._9_3_ = 0;
  auVar77[0xc] = PVar2;
  auVar77._13_3_ = 0;
  auVar71 = vpcmpgtd_avx(auVar77,_DAT_01ff0cf0);
  auVar7 = vcmpps_avx(local_368,auVar67,2);
  auVar7 = vandps_avx(auVar7,auVar71);
  uVar50 = vmovmskps_avx(auVar7);
  local_669 = uVar50 != 0;
  if (uVar50 == 0) {
    return local_669;
  }
  uVar50 = uVar50 & 0xff;
  pLVar62 = pre->ray_space + k;
  auVar73._16_16_ = mm_lookupmask_ps._240_16_;
  auVar73._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar73,ZEXT832(0) << 0x20,0x80);
  local_538 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_530 = pLVar62;
LAB_016abd80:
  lVar57 = 0;
  for (uVar55 = (ulong)uVar50; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  local_388 = *(uint *)(prim + lVar57 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar54].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)local_388 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar7 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar55);
  lVar57 = uVar55 + 1;
  auVar71 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * lVar57);
  _Var5 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar272 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * uVar55);
  auVar8 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * lVar57);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar78._8_4_ = 0x3eaaaaab;
  auVar78._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar78._12_4_ = 0x3eaaaaab;
  auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * uVar55),auVar7,auVar78);
  auVar76 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              (long)pGVar3[2].pointQueryFunc * lVar57),auVar71,auVar78);
  auVar67 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar3[3].userPtr +
                             uVar55 * *(long *)&pGVar3[3].fnumTimeSegments),auVar272,auVar78);
  auVar202 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar3[3].userPtr +
                               *(long *)&pGVar3[3].fnumTimeSegments * lVar57),auVar8,auVar78);
  auVar68._12_4_ = 0;
  auVar68._0_12_ = ZEXT812(0);
  auVar68 = auVar68 << 0x20;
  auVar79._0_4_ = auVar71._0_4_ * 0.0;
  auVar79._4_4_ = auVar71._4_4_ * 0.0;
  auVar79._8_4_ = auVar71._8_4_ * 0.0;
  auVar79._12_4_ = auVar71._12_4_ * 0.0;
  auVar96 = vfmadd231ps_fma(auVar79,auVar76,auVar68);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar96);
  local_668._0_4_ = auVar7._0_4_ + auVar66._0_4_;
  local_668._4_4_ = auVar7._4_4_ + auVar66._4_4_;
  fStack_660 = auVar7._8_4_ + auVar66._8_4_;
  fStack_65c = auVar7._12_4_ + auVar66._12_4_;
  auVar270._8_4_ = 0x40400000;
  auVar270._0_8_ = 0x4040000040400000;
  auVar270._12_4_ = 0x40400000;
  auVar66 = vfmadd231ps_fma(auVar96,auVar10,auVar270);
  auVar77 = vfnmadd231ps_fma(auVar66,auVar7,auVar270);
  auVar238._0_4_ = auVar8._0_4_ * 0.0;
  auVar238._4_4_ = auVar8._4_4_ * 0.0;
  auVar238._8_4_ = auVar8._8_4_ * 0.0;
  auVar238._12_4_ = auVar8._12_4_ * 0.0;
  auVar96 = vfmadd231ps_fma(auVar238,auVar202,auVar68);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar67,auVar96);
  auVar256._0_4_ = auVar272._0_4_ + auVar66._0_4_;
  auVar256._4_4_ = auVar272._4_4_ + auVar66._4_4_;
  auVar256._8_4_ = auVar272._8_4_ + auVar66._8_4_;
  auVar256._12_4_ = auVar272._12_4_ + auVar66._12_4_;
  auVar66 = vfmadd231ps_fma(auVar96,auVar67,auVar270);
  auVar96 = vfnmadd231ps_fma(auVar66,auVar272,auVar270);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar76,auVar71);
  auVar66 = vfmadd231ps_fma(auVar66,auVar10,auVar68);
  auVar66 = vfmadd231ps_fma(auVar66,auVar7,auVar68);
  auVar123._0_4_ = auVar71._0_4_ * 3.0;
  auVar123._4_4_ = auVar71._4_4_ * 3.0;
  auVar123._8_4_ = auVar71._8_4_ * 3.0;
  auVar123._12_4_ = auVar71._12_4_ * 3.0;
  auVar71 = vfnmadd231ps_fma(auVar123,auVar270,auVar76);
  auVar71 = vfmadd231ps_fma(auVar71,auVar68,auVar10);
  auVar76 = vfnmadd231ps_fma(auVar71,auVar68,auVar7);
  auVar7 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar202,auVar8);
  auVar7 = vfmadd231ps_fma(auVar7,auVar67,auVar68);
  auVar10 = vfmadd231ps_fma(auVar7,auVar272,auVar68);
  auVar184._0_4_ = auVar8._0_4_ * 3.0;
  auVar184._4_4_ = auVar8._4_4_ * 3.0;
  auVar184._8_4_ = auVar8._8_4_ * 3.0;
  auVar184._12_4_ = auVar8._12_4_ * 3.0;
  auVar7 = vfnmadd231ps_fma(auVar184,auVar270,auVar202);
  auVar7 = vfmadd231ps_fma(auVar7,auVar68,auVar67);
  auVar202 = vfnmadd231ps_fma(auVar7,auVar68,auVar272);
  auVar7 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar71 = vshufps_avx(auVar256,auVar256,0xc9);
  fVar64 = auVar77._0_4_;
  auVar197._0_4_ = auVar71._0_4_ * fVar64;
  fVar151 = auVar77._4_4_;
  auVar197._4_4_ = auVar71._4_4_ * fVar151;
  fVar153 = auVar77._8_4_;
  auVar197._8_4_ = auVar71._8_4_ * fVar153;
  fVar74 = auVar77._12_4_;
  auVar197._12_4_ = auVar71._12_4_ * fVar74;
  auVar71 = vfmsub231ps_fma(auVar197,auVar7,auVar256);
  auVar272 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar71 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar214._0_4_ = auVar71._0_4_ * fVar64;
  auVar214._4_4_ = auVar71._4_4_ * fVar151;
  auVar214._8_4_ = auVar71._8_4_ * fVar153;
  auVar214._12_4_ = auVar71._12_4_ * fVar74;
  auVar7 = vfmsub231ps_fma(auVar214,auVar7,auVar96);
  auVar8 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar71 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar7 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar136 = auVar76._0_4_;
  auVar225._0_4_ = auVar7._0_4_ * fVar136;
  fVar152 = auVar76._4_4_;
  auVar225._4_4_ = auVar7._4_4_ * fVar152;
  fVar95 = auVar76._8_4_;
  auVar225._8_4_ = auVar7._8_4_ * fVar95;
  fVar137 = auVar76._12_4_;
  auVar225._12_4_ = auVar7._12_4_ * fVar137;
  auVar7 = vfmsub231ps_fma(auVar225,auVar71,auVar10);
  auVar10 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar67 = vshufps_avx(auVar202,auVar202,0xc9);
  auVar7 = vdpps_avx(auVar272,auVar272,0x7f);
  auVar226._0_4_ = auVar67._0_4_ * fVar136;
  auVar226._4_4_ = auVar67._4_4_ * fVar152;
  auVar226._8_4_ = auVar67._8_4_ * fVar95;
  auVar226._12_4_ = auVar67._12_4_ * fVar137;
  auVar71 = vfmsub231ps_fma(auVar226,auVar71,auVar202);
  auVar67 = vshufps_avx(auVar71,auVar71,0xc9);
  fVar154 = auVar7._0_4_;
  auVar96 = ZEXT416((uint)fVar154);
  auVar71 = vrsqrtss_avx(auVar96,auVar96);
  fVar175 = auVar71._0_4_;
  fVar155 = fVar175 * 1.5 - fVar154 * 0.5 * fVar175 * fVar175 * fVar175;
  auVar71 = vdpps_avx(auVar272,auVar8,0x7f);
  fVar157 = auVar272._0_4_ * fVar155;
  fVar174 = auVar272._4_4_ * fVar155;
  fVar176 = auVar272._8_4_ * fVar155;
  fVar178 = auVar272._12_4_ * fVar155;
  auVar215._0_4_ = fVar154 * auVar8._0_4_;
  auVar215._4_4_ = fVar154 * auVar8._4_4_;
  auVar215._8_4_ = fVar154 * auVar8._8_4_;
  auVar215._12_4_ = fVar154 * auVar8._12_4_;
  fVar175 = auVar71._0_4_;
  auVar198._0_4_ = fVar175 * auVar272._0_4_;
  auVar198._4_4_ = fVar175 * auVar272._4_4_;
  auVar198._8_4_ = fVar175 * auVar272._8_4_;
  auVar198._12_4_ = fVar175 * auVar272._12_4_;
  auVar272 = vsubps_avx(auVar215,auVar198);
  auVar71 = vrcpss_avx(auVar96,auVar96);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar71,SUB6416(ZEXT464(0x40000000),0));
  fVar175 = auVar71._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar154 = auVar7._0_4_;
  auVar96 = ZEXT416((uint)fVar154);
  auVar71 = vrsqrtss_avx(auVar96,auVar96);
  fVar156 = auVar71._0_4_;
  fVar156 = fVar156 * 1.5 - fVar154 * 0.5 * fVar156 * fVar156 * fVar156;
  auVar71 = vdpps_avx(auVar10,auVar67,0x7f);
  fVar255 = fVar156 * auVar10._0_4_;
  fVar265 = fVar156 * auVar10._4_4_;
  fVar266 = fVar156 * auVar10._8_4_;
  fVar267 = fVar156 * auVar10._12_4_;
  auVar185._0_4_ = fVar154 * auVar67._0_4_;
  auVar185._4_4_ = fVar154 * auVar67._4_4_;
  auVar185._8_4_ = fVar154 * auVar67._8_4_;
  auVar185._12_4_ = fVar154 * auVar67._12_4_;
  fVar154 = auVar71._0_4_;
  auVar141._0_4_ = fVar154 * auVar10._0_4_;
  auVar141._4_4_ = fVar154 * auVar10._4_4_;
  auVar141._8_4_ = fVar154 * auVar10._8_4_;
  auVar141._12_4_ = fVar154 * auVar10._12_4_;
  auVar8 = vsubps_avx(auVar185,auVar141);
  auVar71 = vrcpss_avx(auVar96,auVar96);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar71,ZEXT416(0x40000000));
  fVar154 = auVar7._0_4_ * auVar71._0_4_;
  auVar7 = vshufps_avx(_local_668,_local_668,0xff);
  auVar216._0_4_ = auVar7._0_4_ * fVar157;
  auVar216._4_4_ = auVar7._4_4_ * fVar174;
  auVar216._8_4_ = auVar7._8_4_ * fVar176;
  auVar216._12_4_ = auVar7._12_4_ * fVar178;
  local_4c8 = vsubps_avx(_local_668,auVar216);
  auVar71 = vshufps_avx(auVar77,auVar77,0xff);
  auVar159._0_4_ = auVar71._0_4_ * fVar157 + fVar155 * auVar272._0_4_ * fVar175 * auVar7._0_4_;
  auVar159._4_4_ = auVar71._4_4_ * fVar174 + fVar155 * auVar272._4_4_ * fVar175 * auVar7._4_4_;
  auVar159._8_4_ = auVar71._8_4_ * fVar176 + fVar155 * auVar272._8_4_ * fVar175 * auVar7._8_4_;
  auVar159._12_4_ = auVar71._12_4_ * fVar178 + fVar155 * auVar272._12_4_ * fVar175 * auVar7._12_4_;
  auVar272 = vsubps_avx(auVar77,auVar159);
  local_4d8._0_4_ = auVar216._0_4_ + (float)local_668._0_4_;
  local_4d8._4_4_ = auVar216._4_4_ + (float)local_668._4_4_;
  fStack_4d0 = auVar216._8_4_ + fStack_660;
  fStack_4cc = auVar216._12_4_ + fStack_65c;
  auVar7 = vshufps_avx(auVar66,auVar66,0xff);
  auVar97._0_4_ = fVar255 * auVar7._0_4_;
  auVar97._4_4_ = fVar265 * auVar7._4_4_;
  auVar97._8_4_ = fVar266 * auVar7._8_4_;
  auVar97._12_4_ = fVar267 * auVar7._12_4_;
  local_4e8 = vsubps_avx(auVar66,auVar97);
  auVar71 = vshufps_avx(auVar76,auVar76,0xff);
  auVar80._0_4_ = fVar255 * auVar71._0_4_ + auVar7._0_4_ * fVar156 * auVar8._0_4_ * fVar154;
  auVar80._4_4_ = fVar265 * auVar71._4_4_ + auVar7._4_4_ * fVar156 * auVar8._4_4_ * fVar154;
  auVar80._8_4_ = fVar266 * auVar71._8_4_ + auVar7._8_4_ * fVar156 * auVar8._8_4_ * fVar154;
  auVar80._12_4_ = fVar267 * auVar71._12_4_ + auVar7._12_4_ * fVar156 * auVar8._12_4_ * fVar154;
  auVar7 = vsubps_avx(auVar76,auVar80);
  fVar157 = auVar66._0_4_ + auVar97._0_4_;
  fVar174 = auVar66._4_4_ + auVar97._4_4_;
  fVar176 = auVar66._8_4_ + auVar97._8_4_;
  fVar178 = auVar66._12_4_ + auVar97._12_4_;
  local_4f8._0_4_ = local_4c8._0_4_ + auVar272._0_4_ * 0.33333334;
  local_4f8._4_4_ = local_4c8._4_4_ + auVar272._4_4_ * 0.33333334;
  local_4f8._8_4_ = local_4c8._8_4_ + auVar272._8_4_ * 0.33333334;
  local_4f8._12_4_ = local_4c8._12_4_ + auVar272._12_4_ * 0.33333334;
  auVar81._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar81._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar81._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar81._12_4_ = auVar7._12_4_ * 0.33333334;
  local_508 = vsubps_avx(local_4e8,auVar81);
  local_4a8 = vsubps_avx(local_4c8,auVar9);
  auVar7 = vshufps_avx(local_4a8,local_4a8,0x55);
  auVar71 = vshufps_avx(local_4a8,local_4a8,0xaa);
  aVar1 = (pLVar62->vy).field_0;
  fVar175 = (pLVar62->vz).field_0.m128[0];
  fVar154 = *(float *)((long)&(pLVar62->vz).field_0 + 4);
  fVar155 = *(float *)((long)&(pLVar62->vz).field_0 + 8);
  fVar156 = *(float *)((long)&(pLVar62->vz).field_0 + 0xc);
  auVar82._0_4_ = fVar175 * auVar71._0_4_;
  auVar82._4_4_ = fVar154 * auVar71._4_4_;
  auVar82._8_4_ = fVar155 * auVar71._8_4_;
  auVar82._12_4_ = fVar156 * auVar71._12_4_;
  auVar272 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar1,auVar7);
  local_4b8 = vsubps_avx(local_4f8,auVar9);
  auVar7 = vshufps_avx(local_4b8,local_4b8,0x55);
  auVar71 = vshufps_avx(local_4b8,local_4b8,0xaa);
  auVar83._0_4_ = fVar175 * auVar71._0_4_;
  auVar83._4_4_ = fVar154 * auVar71._4_4_;
  auVar83._8_4_ = fVar155 * auVar71._8_4_;
  auVar83._12_4_ = fVar156 * auVar71._12_4_;
  auVar71 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar1,auVar7);
  local_2f8 = vsubps_avx(local_508,auVar9);
  auVar7 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar246._0_4_ = fVar175 * auVar7._0_4_;
  auVar246._4_4_ = fVar154 * auVar7._4_4_;
  auVar246._8_4_ = fVar155 * auVar7._8_4_;
  auVar246._12_4_ = fVar156 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar8 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar1,auVar7);
  local_308 = vsubps_avx(local_4e8,auVar9);
  auVar7 = vshufps_avx(local_308,local_308,0xaa);
  auVar84._0_4_ = fVar175 * auVar7._0_4_;
  auVar84._4_4_ = fVar154 * auVar7._4_4_;
  auVar84._8_4_ = fVar155 * auVar7._8_4_;
  auVar84._12_4_ = fVar156 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_308,local_308,0x55);
  auVar10 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar1,auVar7);
  local_318 = vsubps_avx(_local_4d8,auVar9);
  auVar7 = vshufps_avx(local_318,local_318,0xaa);
  auVar142._0_4_ = fVar175 * auVar7._0_4_;
  auVar142._4_4_ = fVar154 * auVar7._4_4_;
  auVar142._8_4_ = fVar155 * auVar7._8_4_;
  auVar142._12_4_ = fVar156 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_318,local_318,0x55);
  auVar67 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar1,auVar7);
  local_518._0_4_ = (fVar64 + auVar159._0_4_) * 0.33333334 + (float)local_4d8._0_4_;
  local_518._4_4_ = (fVar151 + auVar159._4_4_) * 0.33333334 + (float)local_4d8._4_4_;
  fStack_510 = (fVar153 + auVar159._8_4_) * 0.33333334 + fStack_4d0;
  fStack_50c = (fVar74 + auVar159._12_4_) * 0.33333334 + fStack_4cc;
  local_328 = vsubps_avx(_local_518,auVar9);
  auVar7 = vshufps_avx(local_328,local_328,0xaa);
  auVar199._0_4_ = auVar7._0_4_ * fVar175;
  auVar199._4_4_ = auVar7._4_4_ * fVar154;
  auVar199._8_4_ = auVar7._8_4_ * fVar155;
  auVar199._12_4_ = auVar7._12_4_ * fVar156;
  auVar7 = vshufps_avx(local_328,local_328,0x55);
  auVar66 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar1,auVar7);
  auVar217._0_4_ = (fVar136 + auVar80._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar152 + auVar80._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar95 + auVar80._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar137 + auVar80._12_4_) * 0.33333334;
  auVar43._4_4_ = fVar174;
  auVar43._0_4_ = fVar157;
  auVar43._8_4_ = fVar176;
  auVar43._12_4_ = fVar178;
  _local_528 = vsubps_avx(auVar43,auVar217);
  local_338 = vsubps_avx(_local_528,auVar9);
  auVar7 = vshufps_avx(local_338,local_338,0xaa);
  auVar218._0_4_ = auVar7._0_4_ * fVar175;
  auVar218._4_4_ = auVar7._4_4_ * fVar154;
  auVar218._8_4_ = auVar7._8_4_ * fVar155;
  auVar218._12_4_ = auVar7._12_4_ * fVar156;
  auVar7 = vshufps_avx(local_338,local_338,0x55);
  auVar96 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar1,auVar7);
  local_348 = vsubps_avx(auVar43,auVar9);
  auVar7 = vshufps_avx(local_348,local_348,0xaa);
  auVar85._0_4_ = fVar175 * auVar7._0_4_;
  auVar85._4_4_ = fVar154 * auVar7._4_4_;
  auVar85._8_4_ = fVar155 * auVar7._8_4_;
  auVar85._12_4_ = fVar156 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_348,local_348,0x55);
  auVar7 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar1,auVar7);
  auVar160._4_4_ = local_4a8._0_4_;
  auVar160._0_4_ = local_4a8._0_4_;
  auVar160._8_4_ = local_4a8._0_4_;
  auVar160._12_4_ = local_4a8._0_4_;
  aVar1 = (pLVar62->vx).field_0;
  auVar76 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar1,auVar160);
  auVar161._4_4_ = local_4b8._0_4_;
  auVar161._0_4_ = local_4b8._0_4_;
  auVar161._8_4_ = local_4b8._0_4_;
  auVar161._12_4_ = local_4b8._0_4_;
  auVar202 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar1,auVar161);
  uVar65 = local_2f8._0_4_;
  auVar162._4_4_ = uVar65;
  auVar162._0_4_ = uVar65;
  auVar162._8_4_ = uVar65;
  auVar162._12_4_ = uVar65;
  auVar77 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar162);
  uVar65 = local_308._0_4_;
  auVar163._4_4_ = uVar65;
  auVar163._0_4_ = uVar65;
  auVar163._8_4_ = uVar65;
  auVar163._12_4_ = uVar65;
  auVar110 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar163);
  uVar65 = local_318._0_4_;
  auVar164._4_4_ = uVar65;
  auVar164._0_4_ = uVar65;
  auVar164._8_4_ = uVar65;
  auVar164._12_4_ = uVar65;
  auVar67 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar1,auVar164);
  uVar65 = local_328._0_4_;
  auVar165._4_4_ = uVar65;
  auVar165._0_4_ = uVar65;
  auVar165._8_4_ = uVar65;
  auVar165._12_4_ = uVar65;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar1,auVar165);
  uVar65 = local_338._0_4_;
  auVar166._4_4_ = uVar65;
  auVar166._0_4_ = uVar65;
  auVar166._8_4_ = uVar65;
  auVar166._12_4_ = uVar65;
  auVar96 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar1,auVar166);
  uVar65 = local_348._0_4_;
  auVar167._4_4_ = uVar65;
  auVar167._0_4_ = uVar65;
  auVar167._8_4_ = uVar65;
  auVar167._12_4_ = uVar65;
  auVar122 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar167);
  auVar8 = vmovlhps_avx(auVar76,auVar67);
  auVar9 = vmovlhps_avx(auVar202,auVar66);
  auVar10 = vmovlhps_avx(auVar77,auVar96);
  _local_498 = vmovlhps_avx(auVar110,auVar122);
  auVar7 = vminps_avx(auVar8,auVar9);
  auVar71 = vminps_avx(auVar10,_local_498);
  auVar272 = vminps_avx(auVar7,auVar71);
  auVar7 = vmaxps_avx(auVar8,auVar9);
  auVar71 = vmaxps_avx(auVar10,_local_498);
  auVar7 = vmaxps_avx(auVar7,auVar71);
  auVar71 = vshufpd_avx(auVar272,auVar272,3);
  auVar272 = vminps_avx(auVar272,auVar71);
  auVar71 = vshufpd_avx(auVar7,auVar7,3);
  auVar71 = vmaxps_avx(auVar7,auVar71);
  auVar7 = vandps_avx(auVar277,auVar272);
  auVar71 = vandps_avx(auVar277,auVar71);
  auVar7 = vmaxps_avx(auVar7,auVar71);
  auVar71 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar71,auVar7);
  local_198 = auVar7._0_4_ * 9.536743e-07;
  local_418._8_8_ = auVar76._0_8_;
  local_418._0_8_ = auVar76._0_8_;
  local_428._8_8_ = auVar202._0_8_;
  local_428._0_8_ = auVar202._0_8_;
  local_438._0_8_ = auVar77._0_8_;
  local_438._8_8_ = local_438._0_8_;
  local_668 = auVar110._0_8_;
  local_448._8_8_ = local_668;
  local_448._0_8_ = local_668;
  local_458 = auVar67._0_8_;
  register0x00001348 = local_458;
  register0x000013c8 = auVar66._0_8_;
  local_468 = auVar66._0_8_;
  register0x00001408 = auVar96._0_8_;
  local_478 = auVar96._0_8_;
  register0x00001448 = auVar122._0_8_;
  local_488 = auVar122._0_8_;
  local_2e8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = -local_198;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_378 = uVar54;
  uStack_374 = uVar54;
  uStack_370 = uVar54;
  uStack_36c = uVar54;
  uStack_384 = local_388;
  uStack_380 = local_388;
  uStack_37c = local_388;
  bVar61 = false;
  uVar55 = 0;
  fVar64 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(auVar9,auVar8);
  local_2c8 = vsubps_avx(auVar10,auVar9);
  local_2d8 = vsubps_avx(_local_498,auVar10);
  local_398 = vsubps_avx(_local_4d8,local_4c8);
  local_3a8 = vsubps_avx(_local_518,local_4f8);
  local_3b8 = vsubps_avx(_local_528,local_508);
  auVar44._4_4_ = fVar174;
  auVar44._0_4_ = fVar157;
  auVar44._8_4_ = fVar176;
  auVar44._12_4_ = fVar178;
  _local_3c8 = vsubps_avx(auVar44,local_4e8);
  _local_668 = ZEXT816(0x3f80000000000000);
  local_358 = _local_668;
  do {
    auVar7 = vshufps_avx(_local_668,_local_668,0x50);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = &DAT_3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._0_16_ = auVar111;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar71 = vsubps_avx(auVar111,auVar7);
    fVar136 = auVar7._0_4_;
    auVar69._0_4_ = local_458._0_4_ * fVar136;
    fVar151 = auVar7._4_4_;
    auVar69._4_4_ = local_458._4_4_ * fVar151;
    fVar152 = auVar7._8_4_;
    auVar69._8_4_ = local_458._8_4_ * fVar152;
    fVar153 = auVar7._12_4_;
    auVar69._12_4_ = local_458._12_4_ * fVar153;
    auVar143._0_4_ = local_468._0_4_ * fVar136;
    auVar143._4_4_ = local_468._4_4_ * fVar151;
    auVar143._8_4_ = local_468._8_4_ * fVar152;
    auVar143._12_4_ = local_468._12_4_ * fVar153;
    auVar186._0_4_ = local_478._0_4_ * fVar136;
    auVar186._4_4_ = local_478._4_4_ * fVar151;
    auVar186._8_4_ = local_478._8_4_ * fVar152;
    auVar186._12_4_ = local_478._12_4_ * fVar153;
    auVar271._0_4_ = local_488._0_4_ * fVar136;
    auVar271._4_4_ = local_488._4_4_ * fVar151;
    auVar271._8_4_ = local_488._8_4_ * fVar152;
    auVar271._12_4_ = local_488._12_4_ * fVar153;
    auVar66 = vfmadd231ps_fma(auVar69,auVar71,local_418);
    auVar96 = vfmadd231ps_fma(auVar143,auVar71,local_428);
    auVar76 = vfmadd231ps_fma(auVar186,auVar71,local_438);
    auVar202 = vfmadd231ps_fma(auVar271,local_448,auVar71);
    local_608 = auVar202._0_4_;
    auVar7 = vmovshdup_avx(local_358);
    fVar136 = local_358._0_4_;
    fVar95 = (auVar7._0_4_ - fVar136) * 0.04761905;
    auVar212._4_4_ = fVar136;
    auVar212._0_4_ = fVar136;
    auVar212._8_4_ = fVar136;
    auVar212._12_4_ = fVar136;
    auVar212._16_4_ = fVar136;
    auVar212._20_4_ = fVar136;
    auVar212._24_4_ = fVar136;
    auVar212._28_4_ = fVar136;
    auVar107._0_8_ = auVar7._0_8_;
    auVar107._8_8_ = auVar107._0_8_;
    auVar107._16_8_ = auVar107._0_8_;
    auVar107._24_8_ = auVar107._0_8_;
    auVar73 = vsubps_avx(auVar107,auVar212);
    uVar65 = auVar66._0_4_;
    auVar281._4_4_ = uVar65;
    auVar281._0_4_ = uVar65;
    auVar281._8_4_ = uVar65;
    auVar281._12_4_ = uVar65;
    auVar281._16_4_ = uVar65;
    auVar281._20_4_ = uVar65;
    auVar281._24_4_ = uVar65;
    auVar281._28_4_ = uVar65;
    auVar7 = vmovshdup_avx(auVar66);
    uVar158 = auVar7._0_8_;
    auVar263._8_8_ = uVar158;
    auVar263._0_8_ = uVar158;
    auVar263._16_8_ = uVar158;
    auVar263._24_8_ = uVar158;
    fVar74 = auVar96._0_4_;
    auVar93._4_4_ = fVar74;
    auVar93._0_4_ = fVar74;
    auVar93._8_4_ = fVar74;
    auVar93._12_4_ = fVar74;
    auVar93._16_4_ = fVar74;
    auVar93._20_4_ = fVar74;
    auVar93._24_4_ = fVar74;
    auVar93._28_4_ = fVar74;
    auVar71 = vmovshdup_avx(auVar96);
    auVar171._0_8_ = auVar71._0_8_;
    auVar171._8_8_ = auVar171._0_8_;
    auVar171._16_8_ = auVar171._0_8_;
    auVar171._24_8_ = auVar171._0_8_;
    fVar154 = auVar76._0_4_;
    auVar245._4_4_ = fVar154;
    auVar245._0_4_ = fVar154;
    auVar245._8_4_ = fVar154;
    auVar245._12_4_ = fVar154;
    auVar245._16_4_ = fVar154;
    auVar245._20_4_ = fVar154;
    auVar245._24_4_ = fVar154;
    auVar245._28_4_ = fVar154;
    auVar272 = vmovshdup_avx(auVar76);
    auVar223._0_8_ = auVar272._0_8_;
    auVar223._8_8_ = auVar223._0_8_;
    auVar223._16_8_ = auVar223._0_8_;
    auVar223._24_8_ = auVar223._0_8_;
    auVar67 = vmovshdup_avx(auVar202);
    auVar77 = vfmadd132ps_fma(auVar73,auVar212,_DAT_02020f20);
    auVar73 = vsubps_avx(auVar118,ZEXT1632(auVar77));
    fVar136 = auVar77._0_4_;
    auVar274._0_4_ = fVar74 * fVar136;
    fVar151 = auVar77._4_4_;
    auVar274._4_4_ = fVar74 * fVar151;
    fVar152 = auVar77._8_4_;
    auVar274._8_4_ = fVar74 * fVar152;
    fVar153 = auVar77._12_4_;
    auVar274._12_4_ = fVar74 * fVar153;
    auVar274._16_4_ = fVar74 * 0.0;
    auVar274._20_4_ = fVar74 * 0.0;
    auVar274._24_4_ = fVar74 * 0.0;
    auVar274._28_4_ = 0;
    auVar77 = vfmadd231ps_fma(auVar274,auVar73,auVar281);
    fVar137 = auVar71._0_4_;
    auVar252._0_4_ = fVar137 * fVar136;
    fVar175 = auVar71._4_4_;
    auVar252._4_4_ = fVar175 * fVar151;
    auVar252._8_4_ = fVar137 * fVar152;
    auVar252._12_4_ = fVar175 * fVar153;
    auVar252._16_4_ = fVar137 * 0.0;
    auVar252._20_4_ = fVar175 * 0.0;
    auVar252._24_4_ = fVar137 * 0.0;
    auVar252._28_4_ = 0;
    auVar110 = vfmadd231ps_fma(auVar252,auVar73,auVar263);
    auVar11._4_4_ = fVar154 * fVar151;
    auVar11._0_4_ = fVar154 * fVar136;
    auVar11._8_4_ = fVar154 * fVar152;
    auVar11._12_4_ = fVar154 * fVar153;
    auVar11._16_4_ = fVar154 * 0.0;
    auVar11._20_4_ = fVar154 * 0.0;
    auVar11._24_4_ = fVar154 * 0.0;
    auVar11._28_4_ = auVar7._4_4_;
    auVar122 = vfmadd231ps_fma(auVar11,auVar73,auVar93);
    fVar137 = auVar272._0_4_;
    fVar175 = auVar272._4_4_;
    auVar12._4_4_ = fVar175 * fVar151;
    auVar12._0_4_ = fVar137 * fVar136;
    auVar12._8_4_ = fVar137 * fVar152;
    auVar12._12_4_ = fVar175 * fVar153;
    auVar12._16_4_ = fVar137 * 0.0;
    auVar12._20_4_ = fVar175 * 0.0;
    auVar12._24_4_ = fVar137 * 0.0;
    auVar12._28_4_ = uVar65;
    auVar126 = vfmadd231ps_fma(auVar12,auVar73,auVar171);
    auVar7 = vshufps_avx(auVar66,auVar66,0xaa);
    auVar172._0_8_ = auVar7._0_8_;
    auVar172._8_8_ = auVar172._0_8_;
    auVar172._16_8_ = auVar172._0_8_;
    auVar172._24_8_ = auVar172._0_8_;
    auVar71 = vshufps_avx(auVar66,auVar66,0xff);
    uStack_620 = auVar71._0_8_;
    local_628 = (undefined1  [8])uStack_620;
    uStack_618 = uStack_620;
    uStack_610 = uStack_620;
    auVar13._4_4_ = fVar151 * local_608;
    auVar13._0_4_ = fVar136 * local_608;
    auVar13._8_4_ = fVar152 * local_608;
    auVar13._12_4_ = fVar153 * local_608;
    auVar13._16_4_ = local_608 * 0.0;
    auVar13._20_4_ = local_608 * 0.0;
    auVar13._24_4_ = local_608 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar75 = vfmadd231ps_fma(auVar13,auVar73,auVar245);
    auVar272 = vshufps_avx(auVar96,auVar96,0xaa);
    auVar134._0_8_ = auVar272._0_8_;
    auVar134._8_8_ = auVar134._0_8_;
    auVar134._16_8_ = auVar134._0_8_;
    auVar134._24_8_ = auVar134._0_8_;
    auVar66 = vshufps_avx(auVar96,auVar96,0xff);
    auVar150._0_8_ = auVar66._0_8_;
    auVar150._8_8_ = auVar150._0_8_;
    auVar150._16_8_ = auVar150._0_8_;
    auVar150._24_8_ = auVar150._0_8_;
    fVar137 = auVar67._0_4_;
    fVar175 = auVar67._4_4_;
    auVar14._4_4_ = fVar175 * fVar151;
    auVar14._0_4_ = fVar137 * fVar136;
    auVar14._8_4_ = fVar137 * fVar152;
    auVar14._12_4_ = fVar175 * fVar153;
    auVar14._16_4_ = fVar137 * 0.0;
    auVar14._20_4_ = fVar175 * 0.0;
    auVar14._24_4_ = fVar137 * 0.0;
    auVar14._28_4_ = fVar154;
    auVar121 = vfmadd231ps_fma(auVar14,auVar73,auVar223);
    auVar15._28_4_ = fVar74;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar122._12_4_ * fVar153,
                            CONCAT48(auVar122._8_4_ * fVar152,
                                     CONCAT44(auVar122._4_4_ * fVar151,auVar122._0_4_ * fVar136))));
    auVar77 = vfmadd231ps_fma(auVar15,auVar73,ZEXT1632(auVar77));
    auVar16._28_4_ = auVar71._4_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar126._12_4_ * fVar153,
                            CONCAT48(auVar126._8_4_ * fVar152,
                                     CONCAT44(auVar126._4_4_ * fVar151,auVar126._0_4_ * fVar136))));
    auVar110 = vfmadd231ps_fma(auVar16,auVar73,ZEXT1632(auVar110));
    auVar71 = vshufps_avx(auVar76,auVar76,0xaa);
    uVar158 = auVar71._0_8_;
    auVar253._8_8_ = uVar158;
    auVar253._0_8_ = uVar158;
    auVar253._16_8_ = uVar158;
    auVar253._24_8_ = uVar158;
    auVar67 = vshufps_avx(auVar76,auVar76,0xff);
    uVar158 = auVar67._0_8_;
    auVar275._8_8_ = uVar158;
    auVar275._0_8_ = uVar158;
    auVar275._16_8_ = uVar158;
    auVar275._24_8_ = uVar158;
    auVar122 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar75._12_4_,
                                                  CONCAT48(fVar152 * auVar75._8_4_,
                                                           CONCAT44(fVar151 * auVar75._4_4_,
                                                                    fVar136 * auVar75._0_4_)))),
                               auVar73,ZEXT1632(auVar122));
    auVar96 = vshufps_avx(auVar202,auVar202,0xaa);
    auVar76 = vshufps_avx(auVar202,auVar202,0xff);
    local_608 = auVar76._0_4_;
    fStack_604 = auVar76._4_4_;
    auVar17._28_4_ = fStack_604;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar121._12_4_ * fVar153,
                            CONCAT48(auVar121._8_4_ * fVar152,
                                     CONCAT44(auVar121._4_4_ * fVar151,auVar121._0_4_ * fVar136))));
    auVar76 = vfmadd231ps_fma(auVar17,auVar73,ZEXT1632(auVar126));
    auVar202 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar122._12_4_,
                                                  CONCAT48(fVar152 * auVar122._8_4_,
                                                           CONCAT44(fVar151 * auVar122._4_4_,
                                                                    fVar136 * auVar122._0_4_)))),
                               auVar73,ZEXT1632(auVar77));
    auVar11 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar77));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar76._12_4_,
                                                 CONCAT48(fVar152 * auVar76._8_4_,
                                                          CONCAT44(fVar151 * auVar76._4_4_,
                                                                   fVar136 * auVar76._0_4_)))),
                              auVar73,ZEXT1632(auVar110));
    auVar12 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar110));
    fVar255 = fVar95 * auVar11._0_4_ * 3.0;
    fVar266 = fVar95 * auVar11._4_4_ * 3.0;
    auVar254._4_4_ = fVar266;
    auVar254._0_4_ = fVar255;
    fVar232 = fVar95 * auVar11._8_4_ * 3.0;
    auVar254._8_4_ = fVar232;
    fVar233 = fVar95 * auVar11._12_4_ * 3.0;
    auVar254._12_4_ = fVar233;
    fVar234 = fVar95 * auVar11._16_4_ * 3.0;
    auVar254._16_4_ = fVar234;
    fVar235 = fVar95 * auVar11._20_4_ * 3.0;
    auVar254._20_4_ = fVar235;
    fVar236 = fVar95 * auVar11._24_4_ * 3.0;
    auVar254._24_4_ = fVar236;
    auVar254._28_4_ = 0x40400000;
    local_5a8._0_4_ = fVar95 * auVar12._0_4_ * 3.0;
    local_5a8._4_4_ = fVar95 * auVar12._4_4_ * 3.0;
    fStack_5a0 = fVar95 * auVar12._8_4_ * 3.0;
    fStack_59c = fVar95 * auVar12._12_4_ * 3.0;
    fStack_598 = fVar95 * auVar12._16_4_ * 3.0;
    fStack_594 = fVar95 * auVar12._20_4_ * 3.0;
    fStack_590 = fVar95 * auVar12._24_4_ * 3.0;
    fStack_58c = auVar12._28_4_;
    fVar74 = auVar272._0_4_;
    fVar137 = auVar272._4_4_;
    auVar18._4_4_ = fVar137 * fVar151;
    auVar18._0_4_ = fVar74 * fVar136;
    auVar18._8_4_ = fVar74 * fVar152;
    auVar18._12_4_ = fVar137 * fVar153;
    auVar18._16_4_ = fVar74 * 0.0;
    auVar18._20_4_ = fVar137 * 0.0;
    auVar18._24_4_ = fVar74 * 0.0;
    auVar18._28_4_ = auVar11._28_4_;
    auVar272 = vfmadd231ps_fma(auVar18,auVar73,auVar172);
    fVar74 = auVar66._0_4_;
    fVar175 = auVar66._4_4_;
    auVar19._4_4_ = fVar175 * fVar151;
    auVar19._0_4_ = fVar74 * fVar136;
    auVar19._8_4_ = fVar74 * fVar152;
    auVar19._12_4_ = fVar175 * fVar153;
    auVar19._16_4_ = fVar74 * 0.0;
    auVar19._20_4_ = fVar175 * 0.0;
    auVar19._24_4_ = fVar74 * 0.0;
    auVar19._28_4_ = auVar7._4_4_;
    auVar7 = vfmadd231ps_fma(auVar19,auVar73,_local_628);
    fVar74 = auVar71._0_4_;
    fVar175 = auVar71._4_4_;
    auVar20._4_4_ = fVar175 * fVar151;
    auVar20._0_4_ = fVar74 * fVar136;
    auVar20._8_4_ = fVar74 * fVar152;
    auVar20._12_4_ = fVar175 * fVar153;
    auVar20._16_4_ = fVar74 * 0.0;
    auVar20._20_4_ = fVar175 * 0.0;
    auVar20._24_4_ = fVar74 * 0.0;
    auVar20._28_4_ = fVar95;
    auVar71 = vfmadd231ps_fma(auVar20,auVar73,auVar134);
    fVar74 = auVar67._0_4_;
    fVar154 = auVar67._4_4_;
    auVar21._4_4_ = fVar154 * fVar151;
    auVar21._0_4_ = fVar74 * fVar136;
    auVar21._8_4_ = fVar74 * fVar152;
    auVar21._12_4_ = fVar154 * fVar153;
    auVar21._16_4_ = fVar74 * 0.0;
    auVar21._20_4_ = fVar154 * 0.0;
    auVar21._24_4_ = fVar74 * 0.0;
    auVar21._28_4_ = fVar137;
    auVar67 = vfmadd231ps_fma(auVar21,auVar73,auVar150);
    local_2a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar202));
    fVar74 = auVar96._0_4_;
    fVar137 = auVar96._4_4_;
    auVar22._4_4_ = fVar137 * fVar151;
    auVar22._0_4_ = fVar74 * fVar136;
    auVar22._8_4_ = fVar74 * fVar152;
    auVar22._12_4_ = fVar137 * fVar153;
    auVar22._16_4_ = fVar74 * 0.0;
    auVar22._20_4_ = fVar137 * 0.0;
    auVar22._24_4_ = fVar74 * 0.0;
    auVar22._28_4_ = local_2a8._28_4_;
    auVar66 = vfmadd231ps_fma(auVar22,auVar73,auVar253);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar77));
    auVar23._4_4_ = fVar151 * fStack_604;
    auVar23._0_4_ = fVar136 * local_608;
    auVar23._8_4_ = fVar152 * local_608;
    auVar23._12_4_ = fVar153 * fStack_604;
    auVar23._16_4_ = local_608 * 0.0;
    auVar23._20_4_ = fStack_604 * 0.0;
    auVar23._24_4_ = local_608 * 0.0;
    auVar23._28_4_ = fVar175;
    auVar96 = vfmadd231ps_fma(auVar23,auVar73,auVar275);
    auVar24._28_4_ = fVar137;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar153 * auVar71._12_4_,
                            CONCAT48(fVar152 * auVar71._8_4_,
                                     CONCAT44(fVar151 * auVar71._4_4_,fVar136 * auVar71._0_4_))));
    auVar272 = vfmadd231ps_fma(auVar24,auVar73,ZEXT1632(auVar272));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar67._12_4_,
                                                CONCAT48(fVar152 * auVar67._8_4_,
                                                         CONCAT44(fVar151 * auVar67._4_4_,
                                                                  fVar136 * auVar67._0_4_)))),
                             auVar73,ZEXT1632(auVar7));
    fVar255 = auVar202._0_4_ + fVar255;
    fVar266 = auVar202._4_4_ + fVar266;
    fVar232 = auVar202._8_4_ + fVar232;
    fVar233 = auVar202._12_4_ + fVar233;
    fVar234 = fVar234 + 0.0;
    fVar235 = fVar235 + 0.0;
    fVar236 = fVar236 + 0.0;
    auVar25._28_4_ = 0x40400000;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar96._12_4_ * fVar153,
                            CONCAT48(auVar96._8_4_ * fVar152,
                                     CONCAT44(auVar96._4_4_ * fVar151,auVar96._0_4_ * fVar136))));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar66._12_4_,
                                                 CONCAT48(fVar152 * auVar66._8_4_,
                                                          CONCAT44(fVar151 * auVar66._4_4_,
                                                                   fVar136 * auVar66._0_4_)))),
                              auVar73,ZEXT1632(auVar71));
    auVar67 = vfmadd231ps_fma(auVar25,auVar73,ZEXT1632(auVar67));
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar71._12_4_,
                                                 CONCAT48(fVar152 * auVar71._8_4_,
                                                          CONCAT44(fVar151 * auVar71._4_4_,
                                                                   fVar136 * auVar71._0_4_)))),
                              auVar73,ZEXT1632(auVar272));
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar67._12_4_,
                                                 CONCAT48(fVar152 * auVar67._8_4_,
                                                          CONCAT44(fVar151 * auVar67._4_4_,
                                                                   fVar136 * auVar67._0_4_)))),
                              ZEXT1632(auVar7),auVar73);
    auVar73 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar272));
    auVar11 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar7));
    fVar136 = fVar95 * auVar73._0_4_ * 3.0;
    fVar151 = fVar95 * auVar73._4_4_ * 3.0;
    auVar26._4_4_ = fVar151;
    auVar26._0_4_ = fVar136;
    fVar152 = fVar95 * auVar73._8_4_ * 3.0;
    auVar26._8_4_ = fVar152;
    fVar153 = fVar95 * auVar73._12_4_ * 3.0;
    auVar26._12_4_ = fVar153;
    fVar154 = fVar95 * auVar73._16_4_ * 3.0;
    auVar26._16_4_ = fVar154;
    fVar155 = fVar95 * auVar73._20_4_ * 3.0;
    auVar26._20_4_ = fVar155;
    fVar156 = fVar95 * auVar73._24_4_ * 3.0;
    auVar26._24_4_ = fVar156;
    auVar26._28_4_ = 0x40400000;
    auVar194._0_4_ = fVar95 * auVar11._0_4_ * 3.0;
    auVar194._4_4_ = fVar95 * auVar11._4_4_ * 3.0;
    auVar194._8_4_ = fVar95 * auVar11._8_4_ * 3.0;
    auVar194._12_4_ = fVar95 * auVar11._12_4_ * 3.0;
    auVar194._16_4_ = fVar95 * auVar11._16_4_ * 3.0;
    auVar194._20_4_ = fVar95 * auVar11._20_4_ * 3.0;
    auVar194._24_4_ = fVar95 * auVar11._24_4_ * 3.0;
    auVar194._28_4_ = 0;
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar66));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar96));
    auVar73 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar202));
    auVar11 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar77));
    auVar13 = vsubps_avx(auVar16,local_2a8);
    fVar265 = auVar73._0_4_ + auVar13._0_4_;
    fVar267 = auVar73._4_4_ + auVar13._4_4_;
    fVar177 = auVar73._8_4_ + auVar13._8_4_;
    fVar179 = auVar73._12_4_ + auVar13._12_4_;
    fVar180 = auVar73._16_4_ + auVar13._16_4_;
    fVar181 = auVar73._20_4_ + auVar13._20_4_;
    fVar182 = auVar73._24_4_ + auVar13._24_4_;
    auVar14 = vsubps_avx(local_78,auVar15);
    auVar264._0_4_ = auVar11._0_4_ + auVar14._0_4_;
    auVar264._4_4_ = auVar11._4_4_ + auVar14._4_4_;
    auVar264._8_4_ = auVar11._8_4_ + auVar14._8_4_;
    auVar264._12_4_ = auVar11._12_4_ + auVar14._12_4_;
    auVar264._16_4_ = auVar11._16_4_ + auVar14._16_4_;
    auVar264._20_4_ = auVar11._20_4_ + auVar14._20_4_;
    auVar264._24_4_ = auVar11._24_4_ + auVar14._24_4_;
    auVar264._28_4_ = auVar11._28_4_ + auVar14._28_4_;
    fVar95 = auVar77._0_4_;
    local_158 = fVar95 + (float)local_5a8._0_4_;
    fVar74 = auVar77._4_4_;
    fStack_154 = fVar74 + (float)local_5a8._4_4_;
    fVar137 = auVar77._8_4_;
    fStack_150 = fVar137 + fStack_5a0;
    fVar175 = auVar77._12_4_;
    fStack_14c = fVar175 + fStack_59c;
    fStack_148 = fStack_598 + 0.0;
    fStack_144 = fStack_594 + 0.0;
    fStack_140 = fStack_590 + 0.0;
    fStack_13c = auVar12._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar202);
    auVar11 = vsubps_avx(local_98,auVar254);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    local_b8 = ZEXT1632(auVar77);
    auVar11 = vsubps_avx(local_b8,_local_5a8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    local_f8._0_4_ = auVar66._0_4_ + fVar136;
    local_f8._4_4_ = auVar66._4_4_ + fVar151;
    local_f8._8_4_ = auVar66._8_4_ + fVar152;
    local_f8._12_4_ = auVar66._12_4_ + fVar153;
    local_f8._16_4_ = fVar154 + 0.0;
    local_f8._20_4_ = fVar155 + 0.0;
    local_f8._24_4_ = fVar156 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar254 = ZEXT1632(auVar66);
    auVar11 = vsubps_avx(auVar254,auVar26);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    fVar136 = auVar96._0_4_;
    local_138._0_4_ = fVar136 + auVar194._0_4_;
    fVar151 = auVar96._4_4_;
    local_138._4_4_ = fVar151 + auVar194._4_4_;
    fVar152 = auVar96._8_4_;
    local_138._8_4_ = fVar152 + auVar194._8_4_;
    fVar153 = auVar96._12_4_;
    local_138._12_4_ = fVar153 + auVar194._12_4_;
    local_138._16_4_ = auVar194._16_4_ + 0.0;
    local_138._20_4_ = auVar194._20_4_ + 0.0;
    local_138._24_4_ = auVar194._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar11 = vsubps_avx(ZEXT1632(auVar96),auVar194);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    auVar27._4_4_ = fVar74 * fVar267;
    auVar27._0_4_ = fVar95 * fVar265;
    auVar27._8_4_ = fVar137 * fVar177;
    auVar27._12_4_ = fVar175 * fVar179;
    auVar27._16_4_ = fVar180 * 0.0;
    auVar27._20_4_ = fVar181 * 0.0;
    auVar27._24_4_ = fVar182 * 0.0;
    auVar27._28_4_ = auVar11._28_4_;
    auVar7 = vfnmadd231ps_fma(auVar27,local_98,auVar264);
    auVar28._4_4_ = fStack_154 * fVar267;
    auVar28._0_4_ = local_158 * fVar265;
    auVar28._8_4_ = fStack_150 * fVar177;
    auVar28._12_4_ = fStack_14c * fVar179;
    auVar28._16_4_ = fStack_148 * fVar180;
    auVar28._20_4_ = fStack_144 * fVar181;
    auVar28._24_4_ = fStack_140 * fVar182;
    auVar28._28_4_ = auVar17._28_4_;
    auVar41._4_4_ = fVar266;
    auVar41._0_4_ = fVar255;
    auVar41._8_4_ = fVar232;
    auVar41._12_4_ = fVar233;
    auVar41._16_4_ = fVar234;
    auVar41._20_4_ = fVar235;
    auVar41._24_4_ = fVar236;
    auVar41._28_4_ = 0x40400000;
    auVar71 = vfnmadd231ps_fma(auVar28,auVar264,auVar41);
    auVar29._4_4_ = local_178._4_4_ * fVar267;
    auVar29._0_4_ = local_178._0_4_ * fVar265;
    auVar29._8_4_ = local_178._8_4_ * fVar177;
    auVar29._12_4_ = local_178._12_4_ * fVar179;
    auVar29._16_4_ = local_178._16_4_ * fVar180;
    auVar29._20_4_ = local_178._20_4_ * fVar181;
    auVar29._24_4_ = local_178._24_4_ * fVar182;
    auVar29._28_4_ = fStack_13c;
    auVar272 = vfnmadd231ps_fma(auVar29,local_d8,auVar264);
    local_628._0_4_ = auVar15._0_4_;
    local_628._4_4_ = auVar15._4_4_;
    uStack_620._0_4_ = auVar15._8_4_;
    uStack_620._4_4_ = auVar15._12_4_;
    uStack_618._0_4_ = auVar15._16_4_;
    uStack_618._4_4_ = auVar15._20_4_;
    uStack_610._0_4_ = auVar15._24_4_;
    auVar30._4_4_ = fVar267 * (float)local_628._4_4_;
    auVar30._0_4_ = fVar265 * (float)local_628._0_4_;
    auVar30._8_4_ = fVar177 * (float)uStack_620;
    auVar30._12_4_ = fVar179 * uStack_620._4_4_;
    auVar30._16_4_ = fVar180 * (float)uStack_618;
    auVar30._20_4_ = fVar181 * uStack_618._4_4_;
    auVar30._24_4_ = fVar182 * (float)uStack_610;
    auVar30._28_4_ = local_178._28_4_;
    auVar67 = vfnmadd231ps_fma(auVar30,local_2a8,auVar264);
    auVar49._4_4_ = fVar151 * fVar267;
    auVar49._0_4_ = fVar136 * fVar265;
    auVar49._8_4_ = fVar152 * fVar177;
    auVar49._12_4_ = fVar153 * fVar179;
    auVar49._16_4_ = fVar180 * 0.0;
    auVar49._20_4_ = fVar181 * 0.0;
    auVar49._24_4_ = fVar182 * 0.0;
    auVar49._28_4_ = DAT_0205d4a0._28_4_;
    auVar66 = vfnmadd231ps_fma(auVar49,auVar254,auVar264);
    auVar31._4_4_ = local_138._4_4_ * fVar267;
    auVar31._0_4_ = local_138._0_4_ * fVar265;
    auVar31._8_4_ = local_138._8_4_ * fVar177;
    auVar31._12_4_ = local_138._12_4_ * fVar179;
    auVar31._16_4_ = local_138._16_4_ * fVar180;
    auVar31._20_4_ = local_138._20_4_ * fVar181;
    auVar31._24_4_ = local_138._24_4_ * fVar182;
    auVar31._28_4_ = local_2a8._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar31,local_f8,auVar264);
    auVar32._4_4_ = local_118._4_4_ * fVar267;
    auVar32._0_4_ = local_118._0_4_ * fVar265;
    auVar32._8_4_ = local_118._8_4_ * fVar177;
    auVar32._12_4_ = local_118._12_4_ * fVar179;
    auVar32._16_4_ = local_118._16_4_ * fVar180;
    auVar32._20_4_ = local_118._20_4_ * fVar181;
    auVar32._24_4_ = local_118._24_4_ * fVar182;
    auVar32._28_4_ = local_d8._28_4_;
    auVar202 = vfnmadd231ps_fma(auVar32,auVar264,auVar17);
    auVar33._4_4_ = local_78._4_4_ * fVar267;
    auVar33._0_4_ = local_78._0_4_ * fVar265;
    auVar33._8_4_ = local_78._8_4_ * fVar177;
    auVar33._12_4_ = local_78._12_4_ * fVar179;
    auVar33._16_4_ = local_78._16_4_ * fVar180;
    auVar33._20_4_ = local_78._20_4_ * fVar181;
    auVar33._24_4_ = local_78._24_4_ * fVar182;
    auVar33._28_4_ = auVar73._28_4_ + auVar13._28_4_;
    auVar77 = vfnmadd231ps_fma(auVar33,auVar264,auVar16);
    auVar11 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar71));
    auVar73 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar71));
    auVar12 = vminps_avx(ZEXT1632(auVar272),ZEXT1632(auVar67));
    auVar12 = vminps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(ZEXT1632(auVar272),ZEXT1632(auVar67));
    auVar73 = vmaxps_avx(auVar73,auVar11);
    auVar13 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar76));
    auVar11 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar76));
    auVar14 = vminps_avx(ZEXT1632(auVar202),ZEXT1632(auVar77));
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar202),ZEXT1632(auVar77));
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(auVar73,auVar11);
    auVar48._4_4_ = fStack_194;
    auVar48._0_4_ = local_198;
    auVar48._8_4_ = fStack_190;
    auVar48._12_4_ = fStack_18c;
    auVar48._16_4_ = fStack_188;
    auVar48._20_4_ = fStack_184;
    auVar48._24_4_ = fStack_180;
    auVar48._28_4_ = fStack_17c;
    auVar73 = vcmpps_avx(auVar13,auVar48,2);
    auVar47._4_4_ = fStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = fStack_1b0;
    auVar47._12_4_ = fStack_1ac;
    auVar47._16_4_ = fStack_1a8;
    auVar47._20_4_ = fStack_1a4;
    auVar47._24_4_ = fStack_1a0;
    auVar47._28_4_ = fStack_19c;
    auVar11 = vcmpps_avx(auVar11,auVar47,5);
    auVar73 = vandps_avx(auVar11,auVar73);
    auVar11 = local_288 & auVar73;
    uVar51 = 0;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar11 = vsubps_avx(local_2a8,local_98);
      auVar12 = vsubps_avx(auVar16,auVar254);
      fVar155 = auVar11._0_4_ + auVar12._0_4_;
      fVar156 = auVar11._4_4_ + auVar12._4_4_;
      fVar265 = auVar11._8_4_ + auVar12._8_4_;
      fVar267 = auVar11._12_4_ + auVar12._12_4_;
      fVar177 = auVar11._16_4_ + auVar12._16_4_;
      fVar179 = auVar11._20_4_ + auVar12._20_4_;
      fVar180 = auVar11._24_4_ + auVar12._24_4_;
      auVar13 = vsubps_avx(auVar15,local_b8);
      auVar14 = vsubps_avx(local_78,ZEXT1632(auVar96));
      auVar94._0_4_ = auVar13._0_4_ + auVar14._0_4_;
      auVar94._4_4_ = auVar13._4_4_ + auVar14._4_4_;
      auVar94._8_4_ = auVar13._8_4_ + auVar14._8_4_;
      auVar94._12_4_ = auVar13._12_4_ + auVar14._12_4_;
      auVar94._16_4_ = auVar13._16_4_ + auVar14._16_4_;
      auVar94._20_4_ = auVar13._20_4_ + auVar14._20_4_;
      auVar94._24_4_ = auVar13._24_4_ + auVar14._24_4_;
      fVar154 = auVar14._28_4_;
      auVar94._28_4_ = auVar13._28_4_ + fVar154;
      auVar276._0_4_ = fVar95 * fVar155;
      auVar276._4_4_ = fVar74 * fVar156;
      auVar276._8_4_ = fVar137 * fVar265;
      auVar276._12_4_ = fVar175 * fVar267;
      auVar276._16_4_ = fVar177 * 0.0;
      auVar276._20_4_ = fVar179 * 0.0;
      auVar276._24_4_ = fVar180 * 0.0;
      auVar276._28_4_ = 0;
      auVar66 = vfnmadd231ps_fma(auVar276,auVar94,local_98);
      auVar34._4_4_ = fVar156 * fStack_154;
      auVar34._0_4_ = fVar155 * local_158;
      auVar34._8_4_ = fVar265 * fStack_150;
      auVar34._12_4_ = fVar267 * fStack_14c;
      auVar34._16_4_ = fVar177 * fStack_148;
      auVar34._20_4_ = fVar179 * fStack_144;
      auVar34._24_4_ = fVar180 * fStack_140;
      auVar34._28_4_ = fVar154;
      auVar42._4_4_ = fVar266;
      auVar42._0_4_ = fVar255;
      auVar42._8_4_ = fVar232;
      auVar42._12_4_ = fVar233;
      auVar42._16_4_ = fVar234;
      auVar42._20_4_ = fVar235;
      auVar42._24_4_ = fVar236;
      auVar42._28_4_ = 0x40400000;
      auVar7 = vfnmadd213ps_fma(auVar42,auVar94,auVar34);
      auVar35._4_4_ = fVar156 * local_178._4_4_;
      auVar35._0_4_ = fVar155 * local_178._0_4_;
      auVar35._8_4_ = fVar265 * local_178._8_4_;
      auVar35._12_4_ = fVar267 * local_178._12_4_;
      auVar35._16_4_ = fVar177 * local_178._16_4_;
      auVar35._20_4_ = fVar179 * local_178._20_4_;
      auVar35._24_4_ = fVar180 * local_178._24_4_;
      auVar35._28_4_ = fVar154;
      auVar71 = vfnmadd213ps_fma(local_d8,auVar94,auVar35);
      auVar36._4_4_ = (float)local_628._4_4_ * fVar156;
      auVar36._0_4_ = (float)local_628._0_4_ * fVar155;
      auVar36._8_4_ = (float)uStack_620 * fVar265;
      auVar36._12_4_ = uStack_620._4_4_ * fVar267;
      auVar36._16_4_ = (float)uStack_618 * fVar177;
      auVar36._20_4_ = uStack_618._4_4_ * fVar179;
      auVar36._24_4_ = (float)uStack_610 * fVar180;
      auVar36._28_4_ = fVar154;
      auVar96 = vfnmadd231ps_fma(auVar36,auVar94,local_2a8);
      auVar108._0_4_ = fVar136 * fVar155;
      auVar108._4_4_ = fVar151 * fVar156;
      auVar108._8_4_ = fVar152 * fVar265;
      auVar108._12_4_ = fVar153 * fVar267;
      auVar108._16_4_ = fVar177 * 0.0;
      auVar108._20_4_ = fVar179 * 0.0;
      auVar108._24_4_ = fVar180 * 0.0;
      auVar108._28_4_ = 0;
      auVar76 = vfnmadd231ps_fma(auVar108,auVar94,auVar254);
      auVar37._4_4_ = fVar156 * local_138._4_4_;
      auVar37._0_4_ = fVar155 * local_138._0_4_;
      auVar37._8_4_ = fVar265 * local_138._8_4_;
      auVar37._12_4_ = fVar267 * local_138._12_4_;
      auVar37._16_4_ = fVar177 * local_138._16_4_;
      auVar37._20_4_ = fVar179 * local_138._20_4_;
      auVar37._24_4_ = fVar180 * local_138._24_4_;
      auVar37._28_4_ = auVar15._28_4_;
      auVar272 = vfnmadd213ps_fma(local_f8,auVar94,auVar37);
      auVar38._4_4_ = fVar156 * local_118._4_4_;
      auVar38._0_4_ = fVar155 * local_118._0_4_;
      auVar38._8_4_ = fVar265 * local_118._8_4_;
      auVar38._12_4_ = fVar267 * local_118._12_4_;
      auVar38._16_4_ = fVar177 * local_118._16_4_;
      auVar38._20_4_ = fVar179 * local_118._20_4_;
      auVar38._24_4_ = fVar180 * local_118._24_4_;
      auVar38._28_4_ = auVar15._28_4_;
      auVar67 = vfnmadd213ps_fma(auVar17,auVar94,auVar38);
      auVar39._4_4_ = local_78._4_4_ * fVar156;
      auVar39._0_4_ = local_78._0_4_ * fVar155;
      auVar39._8_4_ = local_78._8_4_ * fVar265;
      auVar39._12_4_ = local_78._12_4_ * fVar267;
      auVar39._16_4_ = local_78._16_4_ * fVar177;
      auVar39._20_4_ = local_78._20_4_ * fVar179;
      auVar39._24_4_ = local_78._24_4_ * fVar180;
      auVar39._28_4_ = auVar11._28_4_ + auVar12._28_4_;
      auVar202 = vfnmadd231ps_fma(auVar39,auVar94,auVar16);
      auVar12 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar7));
      auVar11 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar7));
      auVar13 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar96));
      auVar13 = vminps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar96));
      auVar11 = vmaxps_avx(auVar11,auVar12);
      auVar14 = vminps_avx(ZEXT1632(auVar76),ZEXT1632(auVar272));
      auVar12 = vmaxps_avx(ZEXT1632(auVar76),ZEXT1632(auVar272));
      auVar15 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar202));
      auVar14 = vminps_avx(auVar14,auVar15);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar202));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vcmpps_avx(auVar14,auVar48,2);
      auVar12 = vcmpps_avx(auVar12,auVar47,5);
      auVar11 = vandps_avx(auVar12,auVar11);
      auVar73 = vandps_avx(auVar73,local_288);
      auVar12 = auVar73 & auVar11;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar73 = vandps_avx(auVar11,auVar73);
        uVar51 = vmovmskps_avx(auVar73);
      }
    }
    if (uVar51 != 0) {
      auStack_408[uVar55] = uVar51;
      uVar158 = vmovlps_avx(local_358);
      *(undefined8 *)(&uStack_268 + uVar55 * 2) = uVar158;
      uVar60 = vmovlps_avx(_local_668);
      auStack_58[uVar55] = uVar60;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        if (bVar61) {
          return local_669;
        }
        uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar72._4_4_ = uVar65;
        auVar72._0_4_ = uVar65;
        auVar72._8_4_ = uVar65;
        auVar72._12_4_ = uVar65;
        auVar7 = vcmpps_avx(local_368,auVar72,2);
        uVar54 = vmovmskps_avx(auVar7);
        uVar50 = uVar50 & uVar50 + 0xf & uVar54;
        local_669 = uVar50 != 0;
        if (!local_669) {
          return local_669;
        }
        goto LAB_016abd80;
      }
      uVar52 = (int)uVar55 - 1;
      uVar56 = (ulong)uVar52;
      uVar59 = auStack_408[uVar56];
      uVar51 = (&uStack_268)[uVar56 * 2];
      fVar136 = afStack_264[uVar56 * 2];
      iVar53 = 0;
      for (uVar60 = (ulong)uVar59; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        iVar53 = iVar53 + 1;
      }
      uVar59 = uVar59 - 1 & uVar59;
      if (uVar59 == 0) {
        uVar55 = (ulong)uVar52;
      }
      register0x00001348 = 0;
      local_668 = (undefined1  [8])auStack_58[uVar56];
      auStack_408[uVar56] = uVar59;
      fVar151 = (float)(iVar53 + 1) * 0.14285715;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * (float)iVar53 * 0.14285715)),ZEXT416(uVar51)
                               ,ZEXT416((uint)(1.0 - (float)iVar53 * 0.14285715)));
      auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar151)),ZEXT416(uVar51),
                                ZEXT416((uint)(1.0 - fVar151)));
      auVar173._0_4_ = auVar7._0_4_;
      fVar151 = auVar71._0_4_;
      fVar136 = fVar151 - auVar173._0_4_;
      if (0.16666667 <= fVar136) break;
      auVar272 = vshufps_avx(_local_668,_local_668,0x50);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = &DAT_3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar67 = vsubps_avx(auVar98,auVar272);
      fVar152 = auVar272._0_4_;
      auVar112._0_4_ = fVar152 * (float)local_458._0_4_;
      fVar153 = auVar272._4_4_;
      auVar112._4_4_ = fVar153 * (float)local_458._4_4_;
      fVar95 = auVar272._8_4_;
      auVar112._8_4_ = fVar95 * fStack_450;
      fVar74 = auVar272._12_4_;
      auVar112._12_4_ = fVar74 * fStack_44c;
      auVar124._0_4_ = fVar152 * (float)local_468._0_4_;
      auVar124._4_4_ = fVar153 * (float)local_468._4_4_;
      auVar124._8_4_ = fVar95 * fStack_460;
      auVar124._12_4_ = fVar74 * fStack_45c;
      auVar144._0_4_ = fVar152 * (float)local_478._0_4_;
      auVar144._4_4_ = fVar153 * (float)local_478._4_4_;
      auVar144._8_4_ = fVar95 * fStack_470;
      auVar144._12_4_ = fVar74 * fStack_46c;
      auVar86._0_4_ = fVar152 * (float)local_488._0_4_;
      auVar86._4_4_ = fVar153 * (float)local_488._4_4_;
      auVar86._8_4_ = fVar95 * fStack_480;
      auVar86._12_4_ = fVar74 * fStack_47c;
      auVar272 = vfmadd231ps_fma(auVar112,auVar67,local_418);
      auVar66 = vfmadd231ps_fma(auVar124,auVar67,local_428);
      auVar96 = vfmadd231ps_fma(auVar144,auVar67,local_438);
      auVar67 = vfmadd231ps_fma(auVar86,auVar67,local_448);
      auVar109._16_16_ = auVar272;
      auVar109._0_16_ = auVar272;
      auVar119._16_16_ = auVar66;
      auVar119._0_16_ = auVar66;
      auVar135._16_16_ = auVar96;
      auVar135._0_16_ = auVar96;
      auVar173._4_4_ = auVar173._0_4_;
      auVar173._8_4_ = auVar173._0_4_;
      auVar173._12_4_ = auVar173._0_4_;
      auVar173._20_4_ = fVar151;
      auVar173._16_4_ = fVar151;
      auVar173._24_4_ = fVar151;
      auVar173._28_4_ = fVar151;
      auVar73 = vsubps_avx(auVar119,auVar109);
      auVar66 = vfmadd213ps_fma(auVar73,auVar173,auVar109);
      auVar73 = vsubps_avx(auVar135,auVar119);
      auVar76 = vfmadd213ps_fma(auVar73,auVar173,auVar119);
      auVar272 = vsubps_avx(auVar67,auVar96);
      auVar120._16_16_ = auVar272;
      auVar120._0_16_ = auVar272;
      auVar272 = vfmadd213ps_fma(auVar120,auVar173,auVar135);
      auVar73 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar66));
      auVar67 = vfmadd213ps_fma(auVar73,auVar173,ZEXT1632(auVar66));
      auVar73 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar76));
      auVar272 = vfmadd213ps_fma(auVar73,auVar173,ZEXT1632(auVar76));
      auVar73 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar67));
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar73,auVar173);
      fVar175 = auVar73._4_4_ * 3.0;
      fVar137 = fVar136 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar110._4_4_ + fVar137 * fVar175,
                    auVar110._0_4_ + fVar137 * auVar73._0_4_ * 3.0);
      local_2a8._8_4_ = auVar110._8_4_ + fVar137 * auVar73._8_4_ * 3.0;
      local_2a8._12_4_ = auVar110._12_4_ + fVar137 * auVar73._12_4_ * 3.0;
      auVar67 = vshufpd_avx(auVar110,auVar110,3);
      auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar272 = vsubps_avx(auVar67,auVar110);
      auVar96 = vsubps_avx(auVar66,(undefined1  [16])0x0);
      auVar99._0_4_ = auVar272._0_4_ + auVar96._0_4_;
      auVar99._4_4_ = auVar272._4_4_ + auVar96._4_4_;
      auVar99._8_4_ = auVar272._8_4_ + auVar96._8_4_;
      auVar99._12_4_ = auVar272._12_4_ + auVar96._12_4_;
      auVar272 = vshufps_avx(auVar110,auVar110,0xb1);
      auVar96 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar257._4_4_ = auVar99._0_4_;
      auVar257._0_4_ = auVar99._0_4_;
      auVar257._8_4_ = auVar99._0_4_;
      auVar257._12_4_ = auVar99._0_4_;
      auVar76 = vshufps_avx(auVar99,auVar99,0x55);
      fVar152 = auVar76._0_4_;
      auVar187._0_4_ = auVar272._0_4_ * fVar152;
      fVar153 = auVar76._4_4_;
      auVar187._4_4_ = auVar272._4_4_ * fVar153;
      fVar95 = auVar76._8_4_;
      auVar187._8_4_ = auVar272._8_4_ * fVar95;
      fVar74 = auVar76._12_4_;
      auVar187._12_4_ = auVar272._12_4_ * fVar74;
      auVar200._0_4_ = auVar96._0_4_ * fVar152;
      auVar200._4_4_ = auVar96._4_4_ * fVar153;
      auVar200._8_4_ = auVar96._8_4_ * fVar95;
      auVar200._12_4_ = auVar96._12_4_ * fVar74;
      auVar202 = vfmadd231ps_fma(auVar187,auVar257,auVar110);
      auVar77 = vfmadd231ps_fma(auVar200,auVar257,local_2a8._0_16_);
      auVar96 = vshufps_avx(auVar202,auVar202,0xe8);
      auVar76 = vshufps_avx(auVar77,auVar77,0xe8);
      auVar272 = vcmpps_avx(auVar96,auVar76,1);
      uVar51 = vextractps_avx(auVar272,0);
      auVar122 = auVar77;
      if ((uVar51 & 1) == 0) {
        auVar122 = auVar202;
      }
      auVar125._0_4_ = fVar137 * auVar73._16_4_ * 3.0;
      auVar125._4_4_ = fVar137 * fVar175;
      auVar125._8_4_ = fVar137 * auVar73._24_4_ * 3.0;
      auVar125._12_4_ = fVar137 * fVar151;
      auVar138 = vsubps_avx((undefined1  [16])0x0,auVar125);
      auVar126 = vshufps_avx(auVar138,auVar138,0xb1);
      auVar75 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar278._0_4_ = auVar126._0_4_ * fVar152;
      auVar278._4_4_ = auVar126._4_4_ * fVar153;
      auVar278._8_4_ = auVar126._8_4_ * fVar95;
      auVar278._12_4_ = auVar126._12_4_ * fVar74;
      auVar100._0_4_ = auVar75._0_4_ * fVar152;
      auVar100._4_4_ = auVar75._4_4_ * fVar153;
      auVar100._8_4_ = auVar75._8_4_ * fVar95;
      auVar100._12_4_ = auVar75._12_4_ * fVar74;
      auVar139 = vfmadd231ps_fma(auVar278,auVar257,auVar138);
      auVar140 = vfmadd231ps_fma(auVar100,(undefined1  [16])0x0,auVar257);
      auVar75 = vshufps_avx(auVar139,auVar139,0xe8);
      auVar121 = vshufps_avx(auVar140,auVar140,0xe8);
      auVar126 = vcmpps_avx(auVar75,auVar121,1);
      uVar51 = vextractps_avx(auVar126,0);
      auVar183 = auVar140;
      if ((uVar51 & 1) == 0) {
        auVar183 = auVar139;
      }
      auVar122 = vmaxss_avx(auVar183,auVar122);
      auVar96 = vminps_avx(auVar96,auVar76);
      auVar76 = vminps_avx(auVar75,auVar121);
      auVar76 = vminps_avx(auVar96,auVar76);
      auVar272 = vshufps_avx(auVar272,auVar272,0x55);
      auVar272 = vblendps_avx(auVar272,auVar126,2);
      auVar126 = vpslld_avx(auVar272,0x1f);
      auVar272 = vshufpd_avx(auVar77,auVar77,1);
      auVar272 = vinsertps_avx(auVar272,auVar140,0x9c);
      auVar96 = vshufpd_avx(auVar202,auVar202,1);
      auVar96 = vinsertps_avx(auVar96,auVar139,0x9c);
      auVar272 = vblendvps_avx(auVar96,auVar272,auVar126);
      auVar96 = vmovshdup_avx(auVar272);
      auVar272 = vmaxss_avx(auVar96,auVar272);
      fVar95 = auVar76._0_4_;
      auVar96 = vmovshdup_avx(auVar76);
      fVar153 = auVar272._0_4_;
      fVar152 = auVar122._0_4_;
      if ((0.0001 <= fVar95) || (fVar153 <= -0.0001)) {
        auVar202 = vcmpps_avx(auVar96,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar77 = vcmpps_avx(auVar76,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar202 = vorps_avx(auVar77,auVar202);
        if ((-0.0001 < fVar152 & auVar202[0]) != 0) goto LAB_016acdcd;
        auVar202 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar272,5);
        auVar77 = vcmpps_avx(auVar96,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar202 = vorps_avx(auVar77,auVar202);
        if ((auVar202 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016acdcd;
LAB_016ad939:
        bVar40 = true;
      }
      else {
LAB_016acdcd:
        auVar77 = vcmpps_avx(auVar76,_DAT_01feba10,1);
        auVar126 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar202 = vcmpss_avx(auVar122,ZEXT816(0) << 0x20,1);
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = &DAT_3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        auVar201._8_4_ = 0xbf800000;
        auVar201._0_8_ = 0xbf800000bf800000;
        auVar201._12_4_ = 0xbf800000;
        auVar202 = vblendvps_avx(auVar145,auVar201,auVar202);
        auVar77 = vblendvps_avx(auVar145,auVar201,auVar77);
        fVar74 = auVar77._0_4_;
        fVar137 = auVar202._0_4_;
        auVar202 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar74 == fVar137) && (!NAN(fVar74) && !NAN(fVar137))) {
          auVar202 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar75 = ZEXT816(0) << 0x20;
        if ((fVar74 == fVar137) && (!NAN(fVar74) && !NAN(fVar137))) {
          auVar126 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar77 = vmovshdup_avx(auVar77);
        fVar175 = auVar77._0_4_;
        if ((fVar74 != fVar175) || (NAN(fVar74) || NAN(fVar175))) {
          fVar74 = auVar96._0_4_;
          if ((fVar74 != fVar95) || (NAN(fVar74) || NAN(fVar95))) {
            auVar101._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar101._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar127._0_4_ = -fVar95 / (fVar74 - fVar95);
            auVar127._4_12_ = auVar101._4_12_;
            auVar96 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar75,auVar127);
            auVar76 = auVar96;
          }
          else {
            auVar96 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar95 == 0.0) && (auVar96 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar95))) {
              auVar96 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar95 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar95))) {
              auVar76 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar202 = vminss_avx(auVar202,auVar96);
          auVar126 = vmaxss_avx(auVar76,auVar126);
        }
        auVar272 = vcmpss_avx(auVar272,auVar75,1);
        auVar128._8_4_ = 0x3f800000;
        auVar128._0_8_ = &DAT_3f8000003f800000;
        auVar128._12_4_ = 0x3f800000;
        auVar146._8_4_ = 0xbf800000;
        auVar146._0_8_ = 0xbf800000bf800000;
        auVar146._12_4_ = 0xbf800000;
        auVar272 = vblendvps_avx(auVar128,auVar146,auVar272);
        fVar95 = auVar272._0_4_;
        auVar272 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar137 != fVar95) || (NAN(fVar137) || NAN(fVar95))) {
          if ((fVar153 != fVar152) || (NAN(fVar153) || NAN(fVar152))) {
            auVar102._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar102._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar102._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar129._0_4_ = -fVar152 / (fVar153 - fVar152);
            auVar129._4_12_ = auVar102._4_12_;
            auVar96 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar75,auVar129);
            auVar76 = auVar96;
          }
          else {
            auVar96 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar152 == 0.0) && (auVar96 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar152))) {
              auVar96 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar152 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar152))) {
              auVar76 = auVar272;
            }
          }
          auVar202 = vminss_avx(auVar202,auVar96);
          auVar126 = vmaxss_avx(auVar76,auVar126);
        }
        if ((fVar175 != fVar95) || (NAN(fVar175) || NAN(fVar95))) {
          auVar202 = vminss_avx(auVar202,auVar272);
          auVar126 = vmaxss_avx(auVar272,auVar126);
        }
        auVar96 = vmaxss_avx(auVar75,auVar202);
        auVar76 = vminss_avx(auVar126,auVar272);
        bVar40 = true;
        if (auVar96._0_4_ <= auVar76._0_4_) {
          auVar96 = vmaxss_avx(auVar75,ZEXT416((uint)(auVar96._0_4_ + -0.1)));
          auVar272 = vminss_avx(ZEXT416((uint)(auVar76._0_4_ + 0.1)),auVar272);
          auVar87._0_8_ = auVar110._0_8_;
          auVar87._8_8_ = auVar87._0_8_;
          auVar203._8_8_ = local_2a8._0_8_;
          auVar203._0_8_ = local_2a8._0_8_;
          auVar219._8_8_ = auVar138._0_8_;
          auVar219._0_8_ = auVar138._0_8_;
          auVar76 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
          auVar202 = vshufpd_avx(auVar138,auVar138,3);
          auVar77 = vshufps_avx(auVar96,auVar272,0);
          auVar113._8_4_ = 0x3f800000;
          auVar113._0_8_ = &DAT_3f8000003f800000;
          auVar113._12_4_ = 0x3f800000;
          auVar110 = vsubps_avx(auVar113,auVar77);
          local_5a8._0_4_ = auVar67._0_4_;
          local_5a8._4_4_ = auVar67._4_4_;
          fStack_5a0 = auVar67._8_4_;
          fStack_59c = auVar67._12_4_;
          fVar152 = auVar77._0_4_;
          auVar114._0_4_ = fVar152 * (float)local_5a8._0_4_;
          fVar153 = auVar77._4_4_;
          auVar114._4_4_ = fVar153 * (float)local_5a8._4_4_;
          fVar95 = auVar77._8_4_;
          auVar114._8_4_ = fVar95 * fStack_5a0;
          fVar74 = auVar77._12_4_;
          auVar114._12_4_ = fVar74 * fStack_59c;
          auVar130._0_4_ = auVar76._0_4_ * fVar152;
          auVar130._4_4_ = auVar76._4_4_ * fVar153;
          auVar130._8_4_ = auVar76._8_4_ * fVar95;
          auVar130._12_4_ = auVar76._12_4_ * fVar74;
          auVar147._0_4_ = auVar202._0_4_ * fVar152;
          auVar147._4_4_ = auVar202._4_4_ * fVar153;
          auVar147._8_4_ = auVar202._8_4_ * fVar95;
          auVar147._12_4_ = auVar202._12_4_ * fVar74;
          local_628._0_4_ = auVar66._0_4_;
          local_628._4_4_ = auVar66._4_4_;
          uStack_620._0_4_ = auVar66._8_4_;
          uStack_620._4_4_ = auVar66._12_4_;
          auVar168._0_4_ = fVar152 * (float)local_628._0_4_;
          auVar168._4_4_ = fVar153 * (float)local_628._4_4_;
          auVar168._8_4_ = fVar95 * (float)uStack_620;
          auVar168._12_4_ = fVar74 * uStack_620._4_4_;
          auVar76 = vfmadd231ps_fma(auVar114,auVar110,auVar87);
          auVar202 = vfmadd231ps_fma(auVar130,auVar110,auVar203);
          auVar77 = vfmadd231ps_fma(auVar147,auVar110,auVar219);
          auVar110 = vfmadd231ps_fma(auVar168,auVar110,ZEXT816(0));
          auVar67 = vmovshdup_avx(_local_668);
          auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar96._0_4_)),_local_668,
                                    ZEXT416((uint)(1.0 - auVar96._0_4_)));
          auVar121 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar272._0_4_)),_local_668,
                                     ZEXT416((uint)(1.0 - auVar272._0_4_)));
          fVar152 = 1.0 / fVar136;
          auVar272 = vsubps_avx(auVar202,auVar76);
          auVar188._0_4_ = auVar272._0_4_ * 3.0;
          auVar188._4_4_ = auVar272._4_4_ * 3.0;
          auVar188._8_4_ = auVar272._8_4_ * 3.0;
          auVar188._12_4_ = auVar272._12_4_ * 3.0;
          auVar272 = vsubps_avx(auVar77,auVar202);
          auVar204._0_4_ = auVar272._0_4_ * 3.0;
          auVar204._4_4_ = auVar272._4_4_ * 3.0;
          auVar204._8_4_ = auVar272._8_4_ * 3.0;
          auVar204._12_4_ = auVar272._12_4_ * 3.0;
          auVar272 = vsubps_avx(auVar110,auVar77);
          auVar220._0_4_ = auVar272._0_4_ * 3.0;
          auVar220._4_4_ = auVar272._4_4_ * 3.0;
          auVar220._8_4_ = auVar272._8_4_ * 3.0;
          auVar220._12_4_ = auVar272._12_4_ * 3.0;
          auVar67 = vminps_avx(auVar204,auVar220);
          auVar272 = vmaxps_avx(auVar204,auVar220);
          auVar67 = vminps_avx(auVar188,auVar67);
          auVar272 = vmaxps_avx(auVar188,auVar272);
          auVar66 = vshufpd_avx(auVar67,auVar67,3);
          auVar96 = vshufpd_avx(auVar272,auVar272,3);
          auVar67 = vminps_avx(auVar67,auVar66);
          auVar272 = vmaxps_avx(auVar272,auVar96);
          auVar205._0_4_ = auVar67._0_4_ * fVar152;
          auVar205._4_4_ = auVar67._4_4_ * fVar152;
          auVar205._8_4_ = auVar67._8_4_ * fVar152;
          auVar205._12_4_ = auVar67._12_4_ * fVar152;
          auVar189._0_4_ = fVar152 * auVar272._0_4_;
          auVar189._4_4_ = fVar152 * auVar272._4_4_;
          auVar189._8_4_ = fVar152 * auVar272._8_4_;
          auVar189._12_4_ = fVar152 * auVar272._12_4_;
          fVar152 = 1.0 / (auVar121._0_4_ - auVar75._0_4_);
          auVar272 = vshufpd_avx(auVar76,auVar76,3);
          auVar67 = vshufpd_avx(auVar202,auVar202,3);
          auVar66 = vshufpd_avx(auVar77,auVar77,3);
          auVar96 = vshufpd_avx(auVar110,auVar110,3);
          auVar272 = vsubps_avx(auVar272,auVar76);
          auVar76 = vsubps_avx(auVar67,auVar202);
          auVar202 = vsubps_avx(auVar66,auVar77);
          auVar96 = vsubps_avx(auVar96,auVar110);
          auVar67 = vminps_avx(auVar272,auVar76);
          auVar272 = vmaxps_avx(auVar272,auVar76);
          auVar66 = vminps_avx(auVar202,auVar96);
          auVar66 = vminps_avx(auVar67,auVar66);
          auVar67 = vmaxps_avx(auVar202,auVar96);
          auVar272 = vmaxps_avx(auVar272,auVar67);
          auVar239._0_4_ = fVar152 * auVar66._0_4_;
          auVar239._4_4_ = fVar152 * auVar66._4_4_;
          auVar239._8_4_ = fVar152 * auVar66._8_4_;
          auVar239._12_4_ = fVar152 * auVar66._12_4_;
          auVar227._0_4_ = fVar152 * auVar272._0_4_;
          auVar227._4_4_ = fVar152 * auVar272._4_4_;
          auVar227._8_4_ = fVar152 * auVar272._8_4_;
          auVar227._12_4_ = fVar152 * auVar272._12_4_;
          auVar96 = vinsertps_avx(auVar7,auVar75,0x10);
          auVar76 = vinsertps_avx(auVar71,auVar121,0x10);
          auVar70._0_4_ = (auVar96._0_4_ + auVar76._0_4_) * 0.5;
          auVar70._4_4_ = (auVar96._4_4_ + auVar76._4_4_) * 0.5;
          auVar70._8_4_ = (auVar96._8_4_ + auVar76._8_4_) * 0.5;
          auVar70._12_4_ = (auVar96._12_4_ + auVar76._12_4_) * 0.5;
          auVar115._4_4_ = auVar70._0_4_;
          auVar115._0_4_ = auVar70._0_4_;
          auVar115._8_4_ = auVar70._0_4_;
          auVar115._12_4_ = auVar70._0_4_;
          auVar272 = vfmadd213ps_fma(local_2b8,auVar115,auVar8);
          auVar67 = vfmadd213ps_fma(local_2c8,auVar115,auVar9);
          auVar66 = vfmadd213ps_fma(local_2d8,auVar115,auVar10);
          auVar71 = vsubps_avx(auVar67,auVar272);
          auVar272 = vfmadd213ps_fma(auVar71,auVar115,auVar272);
          auVar71 = vsubps_avx(auVar66,auVar67);
          auVar71 = vfmadd213ps_fma(auVar71,auVar115,auVar67);
          auVar71 = vsubps_avx(auVar71,auVar272);
          auVar272 = vfmadd231ps_fma(auVar272,auVar71,auVar115);
          auVar116._0_8_ = CONCAT44(auVar71._4_4_ * 3.0,auVar71._0_4_ * 3.0);
          auVar116._8_4_ = auVar71._8_4_ * 3.0;
          auVar116._12_4_ = auVar71._12_4_ * 3.0;
          auVar221._8_8_ = auVar272._0_8_;
          auVar221._0_8_ = auVar272._0_8_;
          auVar71 = vshufpd_avx(auVar272,auVar272,3);
          auVar272 = vshufps_avx(auVar70,auVar70,0x55);
          auVar202 = vsubps_avx(auVar71,auVar221);
          auVar110 = vfmadd231ps_fma(auVar221,auVar272,auVar202);
          auVar258._8_8_ = auVar116._0_8_;
          auVar258._0_8_ = auVar116._0_8_;
          auVar71 = vshufpd_avx(auVar116,auVar116,3);
          auVar71 = vsubps_avx(auVar71,auVar258);
          auVar77 = vfmadd213ps_fma(auVar71,auVar272,auVar258);
          auVar272 = vmovshdup_avx(auVar77);
          auVar259._0_8_ = auVar272._0_8_ ^ 0x8000000080000000;
          auVar259._8_4_ = auVar272._8_4_ ^ 0x80000000;
          auVar259._12_4_ = auVar272._12_4_ ^ 0x80000000;
          auVar67 = vmovshdup_avx(auVar202);
          auVar71 = vunpcklps_avx(auVar67,auVar259);
          auVar66 = vshufps_avx(auVar71,auVar259,4);
          auVar279._0_8_ = auVar202._0_8_ ^ 0x8000000080000000;
          auVar279._8_4_ = auVar202._8_4_ ^ 0x80000000;
          auVar279._12_4_ = auVar202._12_4_ ^ 0x80000000;
          auVar71 = vmovlhps_avx(auVar279,auVar77);
          auVar71 = vshufps_avx(auVar71,auVar77,8);
          auVar272 = vfmsub231ss_fma(ZEXT416((uint)(auVar272._0_4_ * auVar202._0_4_)),auVar67,
                                     auVar77);
          auVar131._0_4_ = auVar272._0_4_;
          auVar131._4_4_ = auVar131._0_4_;
          auVar131._8_4_ = auVar131._0_4_;
          auVar131._12_4_ = auVar131._0_4_;
          auVar272 = vdivps_avx(auVar66,auVar131);
          auVar67 = vdivps_avx(auVar71,auVar131);
          fVar95 = auVar110._0_4_;
          fVar152 = auVar272._0_4_;
          auVar71 = vshufps_avx(auVar110,auVar110,0x55);
          fVar153 = auVar67._0_4_;
          local_628._4_4_ = fVar95 * auVar272._4_4_ + auVar71._4_4_ * auVar67._4_4_;
          local_628._0_4_ = fVar95 * fVar152 + auVar71._0_4_ * fVar153;
          uStack_620._0_4_ = fVar95 * auVar272._8_4_ + auVar71._8_4_ * auVar67._8_4_;
          uStack_620._4_4_ = fVar95 * auVar272._12_4_ + auVar71._12_4_ * auVar67._12_4_;
          auVar202 = vmovshdup_avx(auVar272);
          auVar71 = vinsertps_avx(auVar205,auVar239,0x1c);
          auVar273._0_4_ = auVar202._0_4_ * auVar71._0_4_;
          auVar273._4_4_ = auVar202._4_4_ * auVar71._4_4_;
          auVar273._8_4_ = auVar202._8_4_ * auVar71._8_4_;
          auVar273._12_4_ = auVar202._12_4_ * auVar71._12_4_;
          auVar66 = vinsertps_avx(auVar189,auVar227,0x1c);
          auVar247._0_4_ = auVar202._0_4_ * auVar66._0_4_;
          auVar247._4_4_ = auVar202._4_4_ * auVar66._4_4_;
          auVar247._8_4_ = auVar202._8_4_ * auVar66._8_4_;
          auVar247._12_4_ = auVar202._12_4_ * auVar66._12_4_;
          auVar122 = vminps_avx(auVar273,auVar247);
          auVar110 = vmaxps_avx(auVar247,auVar273);
          auVar202 = vinsertps_avx(auVar239,auVar205,0x4c);
          auVar126 = vmovshdup_avx(auVar67);
          auVar77 = vinsertps_avx(auVar227,auVar189,0x4c);
          auVar228._0_4_ = auVar126._0_4_ * auVar202._0_4_;
          auVar228._4_4_ = auVar126._4_4_ * auVar202._4_4_;
          auVar228._8_4_ = auVar126._8_4_ * auVar202._8_4_;
          auVar228._12_4_ = auVar126._12_4_ * auVar202._12_4_;
          auVar240._0_4_ = auVar126._0_4_ * auVar77._0_4_;
          auVar240._4_4_ = auVar126._4_4_ * auVar77._4_4_;
          auVar240._8_4_ = auVar126._8_4_ * auVar77._8_4_;
          auVar240._12_4_ = auVar126._12_4_ * auVar77._12_4_;
          auVar126 = vminps_avx(auVar228,auVar240);
          auVar88._0_4_ = auVar126._0_4_ + auVar122._0_4_;
          auVar88._4_4_ = auVar126._4_4_ + auVar122._4_4_;
          auVar88._8_4_ = auVar126._8_4_ + auVar122._8_4_;
          auVar88._12_4_ = auVar126._12_4_ + auVar122._12_4_;
          auVar122 = vmaxps_avx(auVar240,auVar228);
          auVar229._0_4_ = auVar110._0_4_ + auVar122._0_4_;
          auVar229._4_4_ = auVar110._4_4_ + auVar122._4_4_;
          auVar229._8_4_ = auVar110._8_4_ + auVar122._8_4_;
          auVar229._12_4_ = auVar110._12_4_ + auVar122._12_4_;
          auVar241._8_8_ = 0x3f80000000000000;
          auVar241._0_8_ = 0x3f80000000000000;
          auVar110 = vsubps_avx(auVar241,auVar229);
          auVar122 = vsubps_avx(auVar241,auVar88);
          auVar126 = vsubps_avx(auVar96,auVar70);
          auVar260._0_4_ = fVar152 * auVar71._0_4_;
          auVar260._4_4_ = fVar152 * auVar71._4_4_;
          auVar260._8_4_ = fVar152 * auVar71._8_4_;
          auVar260._12_4_ = fVar152 * auVar71._12_4_;
          auVar248._0_4_ = fVar152 * auVar66._0_4_;
          auVar248._4_4_ = fVar152 * auVar66._4_4_;
          auVar248._8_4_ = fVar152 * auVar66._8_4_;
          auVar248._12_4_ = fVar152 * auVar66._12_4_;
          auVar66 = vminps_avx(auVar260,auVar248);
          auVar71 = vmaxps_avx(auVar248,auVar260);
          auVar206._0_4_ = fVar153 * auVar202._0_4_;
          auVar206._4_4_ = fVar153 * auVar202._4_4_;
          auVar206._8_4_ = fVar153 * auVar202._8_4_;
          auVar206._12_4_ = fVar153 * auVar202._12_4_;
          auVar190._0_4_ = fVar153 * auVar77._0_4_;
          auVar190._4_4_ = fVar153 * auVar77._4_4_;
          auVar190._8_4_ = fVar153 * auVar77._8_4_;
          auVar190._12_4_ = fVar153 * auVar77._12_4_;
          auVar202 = vminps_avx(auVar206,auVar190);
          auVar261._0_4_ = auVar66._0_4_ + auVar202._0_4_;
          auVar261._4_4_ = auVar66._4_4_ + auVar202._4_4_;
          auVar261._8_4_ = auVar66._8_4_ + auVar202._8_4_;
          auVar261._12_4_ = auVar66._12_4_ + auVar202._12_4_;
          auVar202 = vsubps_avx(auVar76,auVar70);
          auVar66 = vmaxps_avx(auVar190,auVar206);
          fVar95 = auVar126._0_4_;
          auVar207._0_4_ = fVar95 * auVar110._0_4_;
          fVar74 = auVar126._4_4_;
          auVar207._4_4_ = fVar74 * auVar110._4_4_;
          fVar137 = auVar126._8_4_;
          auVar207._8_4_ = fVar137 * auVar110._8_4_;
          fVar175 = auVar126._12_4_;
          auVar207._12_4_ = fVar175 * auVar110._12_4_;
          auVar191._0_4_ = auVar71._0_4_ + auVar66._0_4_;
          auVar191._4_4_ = auVar71._4_4_ + auVar66._4_4_;
          auVar191._8_4_ = auVar71._8_4_ + auVar66._8_4_;
          auVar191._12_4_ = auVar71._12_4_ + auVar66._12_4_;
          auVar249._8_8_ = 0x3f800000;
          auVar249._0_8_ = 0x3f800000;
          auVar71 = vsubps_avx(auVar249,auVar191);
          auVar66 = vsubps_avx(auVar249,auVar261);
          auVar262._0_4_ = fVar95 * auVar122._0_4_;
          auVar262._4_4_ = fVar74 * auVar122._4_4_;
          auVar262._8_4_ = fVar137 * auVar122._8_4_;
          auVar262._12_4_ = fVar175 * auVar122._12_4_;
          fVar154 = auVar202._0_4_;
          auVar230._0_4_ = fVar154 * auVar110._0_4_;
          fVar155 = auVar202._4_4_;
          auVar230._4_4_ = fVar155 * auVar110._4_4_;
          fVar156 = auVar202._8_4_;
          auVar230._8_4_ = fVar156 * auVar110._8_4_;
          fVar255 = auVar202._12_4_;
          auVar230._12_4_ = fVar255 * auVar110._12_4_;
          auVar89._0_4_ = fVar154 * auVar122._0_4_;
          auVar89._4_4_ = fVar155 * auVar122._4_4_;
          auVar89._8_4_ = fVar156 * auVar122._8_4_;
          auVar89._12_4_ = fVar255 * auVar122._12_4_;
          auVar280._0_4_ = fVar95 * auVar71._0_4_;
          auVar280._4_4_ = fVar74 * auVar71._4_4_;
          auVar280._8_4_ = fVar137 * auVar71._8_4_;
          auVar280._12_4_ = fVar175 * auVar71._12_4_;
          auVar242._0_4_ = fVar95 * auVar66._0_4_;
          auVar242._4_4_ = fVar74 * auVar66._4_4_;
          auVar242._8_4_ = fVar137 * auVar66._8_4_;
          auVar242._12_4_ = fVar175 * auVar66._12_4_;
          auVar192._0_4_ = fVar154 * auVar71._0_4_;
          auVar192._4_4_ = fVar155 * auVar71._4_4_;
          auVar192._8_4_ = fVar156 * auVar71._8_4_;
          auVar192._12_4_ = fVar255 * auVar71._12_4_;
          auVar250._0_4_ = fVar154 * auVar66._0_4_;
          auVar250._4_4_ = fVar155 * auVar66._4_4_;
          auVar250._8_4_ = fVar156 * auVar66._8_4_;
          auVar250._12_4_ = fVar255 * auVar66._12_4_;
          auVar71 = vminps_avx(auVar280,auVar242);
          auVar66 = vminps_avx(auVar192,auVar250);
          auVar71 = vminps_avx(auVar71,auVar66);
          auVar66 = vmaxps_avx(auVar242,auVar280);
          auVar202 = vminps_avx(auVar207,auVar262);
          auVar77 = vminps_avx(auVar230,auVar89);
          auVar202 = vminps_avx(auVar202,auVar77);
          auVar71 = vhaddps_avx(auVar71,auVar202);
          auVar202 = vmaxps_avx(auVar250,auVar192);
          auVar66 = vmaxps_avx(auVar202,auVar66);
          auVar202 = vmaxps_avx(auVar262,auVar207);
          auVar77 = vmaxps_avx(auVar89,auVar230);
          auVar202 = vmaxps_avx(auVar77,auVar202);
          auVar66 = vhaddps_avx(auVar66,auVar202);
          auVar202 = vshufps_avx(auVar70,auVar70,0x54);
          auVar202 = vsubps_avx(auVar202,_local_628);
          auVar71 = vshufps_avx(auVar71,auVar71,0xe8);
          auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
          auVar208._0_4_ = auVar202._0_4_ + auVar71._0_4_;
          auVar208._4_4_ = auVar202._4_4_ + auVar71._4_4_;
          auVar208._8_4_ = auVar202._8_4_ + auVar71._8_4_;
          auVar208._12_4_ = auVar202._12_4_ + auVar71._12_4_;
          auVar193._0_4_ = auVar202._0_4_ + auVar66._0_4_;
          auVar193._4_4_ = auVar202._4_4_ + auVar66._4_4_;
          auVar193._8_4_ = auVar202._8_4_ + auVar66._8_4_;
          auVar193._12_4_ = auVar202._12_4_ + auVar66._12_4_;
          auVar71 = vmaxps_avx(auVar96,auVar208);
          auVar66 = vminps_avx(auVar193,auVar76);
          auVar71 = vcmpps_avx(auVar66,auVar71,1);
          auVar71 = vshufps_avx(auVar71,auVar71,0x50);
          _local_668 = vinsertps_avx(auVar75,ZEXT416((uint)auVar121._0_4_),0x10);
          if ((auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar71[0xf] < '\0') goto LAB_016ad939;
          bVar58 = 0;
          if ((auVar173._0_4_ < auVar208._0_4_) && (bVar58 = 0, auVar193._0_4_ < auVar76._0_4_)) {
            auVar66 = vmovshdup_avx(auVar208);
            auVar71 = vcmpps_avx(auVar193,auVar76,1);
            bVar58 = auVar71[4] & auVar75._0_4_ < auVar66._0_4_;
          }
          if (((3 < (uint)uVar55 || fVar136 < 0.001) | bVar58) == 1) {
            lVar57 = 200;
            do {
              fVar137 = auVar202._0_4_;
              fVar74 = 1.0 - fVar137;
              fVar136 = fVar74 * fVar74 * fVar74;
              fVar95 = fVar137 * 3.0 * fVar74 * fVar74;
              fVar74 = fVar74 * fVar137 * fVar137 * 3.0;
              auVar148._4_4_ = fVar136;
              auVar148._0_4_ = fVar136;
              auVar148._8_4_ = fVar136;
              auVar148._12_4_ = fVar136;
              auVar103._4_4_ = fVar95;
              auVar103._0_4_ = fVar95;
              auVar103._8_4_ = fVar95;
              auVar103._12_4_ = fVar95;
              auVar90._4_4_ = fVar74;
              auVar90._0_4_ = fVar74;
              auVar90._8_4_ = fVar74;
              auVar90._12_4_ = fVar74;
              fVar137 = fVar137 * fVar137 * fVar137;
              auVar169._0_4_ = (float)local_498._0_4_ * fVar137;
              auVar169._4_4_ = (float)local_498._4_4_ * fVar137;
              auVar169._8_4_ = fStack_490 * fVar137;
              auVar169._12_4_ = fStack_48c * fVar137;
              auVar71 = vfmadd231ps_fma(auVar169,auVar10,auVar90);
              auVar71 = vfmadd231ps_fma(auVar71,auVar9,auVar103);
              auVar71 = vfmadd231ps_fma(auVar71,auVar8,auVar148);
              auVar91._8_8_ = auVar71._0_8_;
              auVar91._0_8_ = auVar71._0_8_;
              auVar71 = vshufpd_avx(auVar71,auVar71,3);
              auVar66 = vshufps_avx(auVar202,auVar202,0x55);
              auVar71 = vsubps_avx(auVar71,auVar91);
              auVar66 = vfmadd213ps_fma(auVar71,auVar66,auVar91);
              fVar136 = auVar66._0_4_;
              auVar71 = vshufps_avx(auVar66,auVar66,0x55);
              auVar92._0_4_ = fVar152 * fVar136 + fVar153 * auVar71._0_4_;
              auVar92._4_4_ = auVar272._4_4_ * fVar136 + auVar67._4_4_ * auVar71._4_4_;
              auVar92._8_4_ = auVar272._8_4_ * fVar136 + auVar67._8_4_ * auVar71._8_4_;
              auVar92._12_4_ = auVar272._12_4_ * fVar136 + auVar67._12_4_ * auVar71._12_4_;
              auVar202 = vsubps_avx(auVar202,auVar92);
              auVar71 = vandps_avx(auVar277,auVar66);
              auVar66 = vshufps_avx(auVar71,auVar71,0xf5);
              auVar71 = vmaxss_avx(auVar66,auVar71);
              if (auVar71._0_4_ < (float)local_2e8._0_4_) {
                local_218 = auVar202._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar71 = vmovshdup_avx(auVar202);
                  fVar136 = auVar71._0_4_;
                  if ((0.0 <= fVar136) && (fVar136 <= 1.0)) {
                    auVar71 = vinsertps_avx(ZEXT416((uint)(pLVar62->vx).field_0.m128[2]),
                                            ZEXT416(*(uint *)((long)&(pLVar62->vy).field_0 + 8)),
                                            0x1c);
                    auVar110 = vinsertps_avx(auVar71,ZEXT416(*(uint *)((long)&(pLVar62->vz).field_0
                                                                      + 8)),0x28);
                    auVar71 = vdpps_avx(auVar110,local_4a8,0x7f);
                    auVar272 = vdpps_avx(auVar110,local_4b8,0x7f);
                    auVar67 = vdpps_avx(auVar110,local_2f8,0x7f);
                    auVar66 = vdpps_avx(auVar110,local_308,0x7f);
                    auVar96 = vdpps_avx(auVar110,local_318,0x7f);
                    auVar76 = vdpps_avx(auVar110,local_328,0x7f);
                    auVar77 = vdpps_avx(auVar110,local_338,0x7f);
                    auVar110 = vdpps_avx(auVar110,local_348,0x7f);
                    fVar152 = 1.0 - fVar136;
                    auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * auVar96._0_4_)),
                                              ZEXT416((uint)fVar152),auVar71);
                    auVar272 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar136)),
                                               ZEXT416((uint)fVar152),auVar272);
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * fVar136)),
                                              ZEXT416((uint)fVar152),auVar67);
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * auVar110._0_4_)),
                                              ZEXT416((uint)fVar152),auVar66);
                    fVar95 = 1.0 - local_218;
                    fVar136 = fVar95 * local_218 * local_218 * 3.0;
                    fVar137 = local_218 * local_218 * local_218;
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar137)),
                                              ZEXT416((uint)fVar136),auVar67);
                    fVar152 = local_218 * 3.0 * fVar95 * fVar95;
                    auVar272 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar152),auVar272);
                    fVar153 = fVar95 * fVar95 * fVar95;
                    auVar71 = vfmadd231ss_fma(auVar272,ZEXT416((uint)fVar153),auVar71);
                    fVar74 = auVar71._0_4_;
                    if ((fVar64 <= fVar74) &&
                       (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar74 <= fVar175)) {
                      pGVar3 = (context->scene->geometries).items[uVar54].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar63 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar63 = true, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        local_208 = vshufps_avx(auVar202,auVar202,0x55);
                        auVar209._8_4_ = 0x3f800000;
                        auVar209._0_8_ = &DAT_3f8000003f800000;
                        auVar209._12_4_ = 0x3f800000;
                        auVar71 = vsubps_avx(auVar209,local_208);
                        fVar154 = local_208._0_4_;
                        auVar222._0_4_ = fVar154 * (float)local_4d8._0_4_;
                        fVar155 = local_208._4_4_;
                        auVar222._4_4_ = fVar155 * (float)local_4d8._4_4_;
                        fVar156 = local_208._8_4_;
                        auVar222._8_4_ = fVar156 * fStack_4d0;
                        fVar255 = local_208._12_4_;
                        auVar222._12_4_ = fVar255 * fStack_4cc;
                        auVar231._0_4_ = fVar154 * (float)local_518._0_4_;
                        auVar231._4_4_ = fVar155 * (float)local_518._4_4_;
                        auVar231._8_4_ = fVar156 * fStack_510;
                        auVar231._12_4_ = fVar255 * fStack_50c;
                        auVar243._0_4_ = fVar154 * (float)local_528._0_4_;
                        auVar243._4_4_ = fVar155 * (float)local_528._4_4_;
                        auVar243._8_4_ = fVar156 * fStack_520;
                        auVar243._12_4_ = fVar255 * fStack_51c;
                        auVar251._0_4_ = fVar154 * fVar157;
                        auVar251._4_4_ = fVar155 * fVar174;
                        auVar251._8_4_ = fVar156 * fVar176;
                        auVar251._12_4_ = fVar255 * fVar178;
                        auVar272 = vfmadd231ps_fma(auVar222,auVar71,local_4c8);
                        auVar67 = vfmadd231ps_fma(auVar231,auVar71,local_4f8);
                        auVar66 = vfmadd231ps_fma(auVar243,auVar71,local_508);
                        auVar96 = vfmadd231ps_fma(auVar251,auVar71,local_4e8);
                        auVar71 = vsubps_avx(auVar67,auVar272);
                        auVar272 = vsubps_avx(auVar66,auVar67);
                        auVar67 = vsubps_avx(auVar96,auVar66);
                        auVar244._0_4_ = auVar272._0_4_ * local_218;
                        auVar244._4_4_ = auVar272._4_4_ * local_218;
                        auVar244._8_4_ = auVar272._8_4_ * local_218;
                        auVar244._12_4_ = auVar272._12_4_ * local_218;
                        auVar170._4_4_ = fVar95;
                        auVar170._0_4_ = fVar95;
                        auVar170._8_4_ = fVar95;
                        auVar170._12_4_ = fVar95;
                        auVar71 = vfmadd231ps_fma(auVar244,auVar170,auVar71);
                        auVar210._0_4_ = auVar67._0_4_ * local_218;
                        auVar210._4_4_ = auVar67._4_4_ * local_218;
                        auVar210._8_4_ = auVar67._8_4_ * local_218;
                        auVar210._12_4_ = auVar67._12_4_ * local_218;
                        auVar272 = vfmadd231ps_fma(auVar210,auVar170,auVar272);
                        auVar211._0_4_ = auVar272._0_4_ * local_218;
                        auVar211._4_4_ = auVar272._4_4_ * local_218;
                        auVar211._8_4_ = auVar272._8_4_ * local_218;
                        auVar211._12_4_ = auVar272._12_4_ * local_218;
                        auVar272 = vfmadd231ps_fma(auVar211,auVar170,auVar71);
                        auVar149._0_4_ = fVar137 * (float)local_3c8._0_4_;
                        auVar149._4_4_ = fVar137 * (float)local_3c8._4_4_;
                        auVar149._8_4_ = fVar137 * fStack_3c0;
                        auVar149._12_4_ = fVar137 * fStack_3bc;
                        auVar104._4_4_ = fVar136;
                        auVar104._0_4_ = fVar136;
                        auVar104._8_4_ = fVar136;
                        auVar104._12_4_ = fVar136;
                        auVar71 = vfmadd132ps_fma(auVar104,auVar149,local_3b8);
                        auVar132._4_4_ = fVar152;
                        auVar132._0_4_ = fVar152;
                        auVar132._8_4_ = fVar152;
                        auVar132._12_4_ = fVar152;
                        auVar71 = vfmadd132ps_fma(auVar132,auVar71,local_3a8);
                        auVar105._0_4_ = auVar272._0_4_ * 3.0;
                        auVar105._4_4_ = auVar272._4_4_ * 3.0;
                        auVar105._8_4_ = auVar272._8_4_ * 3.0;
                        auVar105._12_4_ = auVar272._12_4_ * 3.0;
                        auVar117._4_4_ = fVar153;
                        auVar117._0_4_ = fVar153;
                        auVar117._8_4_ = fVar153;
                        auVar117._12_4_ = fVar153;
                        auVar272 = vfmadd132ps_fma(auVar117,auVar71,local_398);
                        auVar71 = vshufps_avx(auVar105,auVar105,0xc9);
                        auVar133._0_4_ = auVar272._0_4_ * auVar71._0_4_;
                        auVar133._4_4_ = auVar272._4_4_ * auVar71._4_4_;
                        auVar133._8_4_ = auVar272._8_4_ * auVar71._8_4_;
                        auVar133._12_4_ = auVar272._12_4_ * auVar71._12_4_;
                        auVar71 = vshufps_avx(auVar272,auVar272,0xc9);
                        auVar272 = vfmsub231ps_fma(auVar133,auVar105,auVar71);
                        auVar71 = vshufps_avx(auVar272,auVar272,0x55);
                        local_248[0] = (RTCHitN)auVar71[0];
                        local_248[1] = (RTCHitN)auVar71[1];
                        local_248[2] = (RTCHitN)auVar71[2];
                        local_248[3] = (RTCHitN)auVar71[3];
                        local_248[4] = (RTCHitN)auVar71[4];
                        local_248[5] = (RTCHitN)auVar71[5];
                        local_248[6] = (RTCHitN)auVar71[6];
                        local_248[7] = (RTCHitN)auVar71[7];
                        local_248[8] = (RTCHitN)auVar71[8];
                        local_248[9] = (RTCHitN)auVar71[9];
                        local_248[10] = (RTCHitN)auVar71[10];
                        local_248[0xb] = (RTCHitN)auVar71[0xb];
                        local_248[0xc] = (RTCHitN)auVar71[0xc];
                        local_248[0xd] = (RTCHitN)auVar71[0xd];
                        local_248[0xe] = (RTCHitN)auVar71[0xe];
                        local_248[0xf] = (RTCHitN)auVar71[0xf];
                        local_238 = vshufps_avx(auVar272,auVar272,0xaa);
                        local_228 = auVar272._0_4_;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_1f8 = CONCAT44(uStack_384,local_388);
                        uStack_1f0 = CONCAT44(uStack_37c,uStack_380);
                        local_1e8._4_4_ = uStack_374;
                        local_1e8._0_4_ = local_378;
                        local_1e8._8_4_ = uStack_370;
                        local_1e8._12_4_ = uStack_36c;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar74;
                        local_548 = *local_538;
                        uStack_540 = local_538[1];
                        local_3f8.valid = (int *)&local_548;
                        local_3f8.geometryUserPtr = pGVar3->userPtr;
                        local_3f8.context = context->user;
                        local_3f8.ray = (RTCRayN *)ray;
                        local_3f8.hit = local_248;
                        local_3f8.N = 4;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_3f8);
                        }
                        auVar45._8_8_ = uStack_540;
                        auVar45._0_8_ = local_548;
                        if (auVar45 == (undefined1  [16])0x0) {
                          auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar71 = auVar71 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var6)(&local_3f8);
                          }
                          auVar46._8_8_ = uStack_540;
                          auVar46._0_8_ = local_548;
                          auVar272 = vpcmpeqd_avx((undefined1  [16])0x0,auVar46);
                          auVar71 = auVar272 ^ _DAT_01febe20;
                          auVar106._8_4_ = 0xff800000;
                          auVar106._0_8_ = 0xff800000ff800000;
                          auVar106._12_4_ = 0xff800000;
                          auVar272 = vblendvps_avx(auVar106,*(undefined1 (*) [16])
                                                             (local_3f8.ray + 0x80),auVar272);
                          *(undefined1 (*) [16])(local_3f8.ray + 0x80) = auVar272;
                        }
                        auVar71 = vpslld_avx(auVar71,0x1f);
                        iVar53 = vmovmskps_avx(auVar71);
                        if (iVar53 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar175;
                        }
                        bVar63 = (char)iVar53 != '\0';
                      }
                      bVar61 = (bool)(bVar61 | bVar63);
                      pLVar62 = local_530;
                    }
                  }
                }
                break;
              }
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
          }
          else {
            bVar40 = false;
          }
        }
      }
    } while (bVar40);
    local_358 = vinsertps_avx(auVar7,ZEXT416((uint)fVar151),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }